

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86.cpp
# Opt level: O3

int __thiscall
ncnn::ConvolutionDepthWise_x86::forward_int8_x86
          (ConvolutionDepthWise_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  ulong uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  void *pvVar12;
  void *pvVar13;
  void *pvVar14;
  int *piVar15;
  Layer *pLVar16;
  undefined1 auVar17 [16];
  undefined1 uVar18;
  undefined1 uVar19;
  undefined1 uVar20;
  undefined1 uVar21;
  undefined4 uVar22;
  undefined1 auVar23 [14];
  undefined1 auVar24 [12];
  unkbyte10 Var25;
  undefined1 auVar26 [14];
  undefined1 auVar27 [12];
  unkbyte10 Var28;
  undefined1 auVar29 [12];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined8 uVar34;
  undefined1 uVar35;
  int iVar36;
  int iVar37;
  uint uVar38;
  uint uVar39;
  int iVar40;
  long lVar41;
  long lVar42;
  float fVar43;
  int iVar44;
  undefined4 *puVar45;
  int iVar46;
  undefined1 (*pauVar47) [16];
  int iVar48;
  undefined1 (*pauVar49) [16];
  ulong uVar50;
  int iVar51;
  long lVar52;
  iterator iVar53;
  uint uVar54;
  pointer pfVar55;
  Option *opt_00;
  int iVar56;
  ulong uVar57;
  bool bVar58;
  ushort uVar59;
  int iVar60;
  ushort uVar67;
  ushort uVar68;
  ushort uVar69;
  ushort uVar70;
  ushort uVar71;
  int iVar72;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  ushort uVar66;
  ushort uVar73;
  undefined1 auVar65 [16];
  undefined1 auVar75 [12];
  undefined1 auVar76 [12];
  undefined1 auVar77 [12];
  int iVar78;
  int iVar87;
  int iVar89;
  __m128 min;
  int iVar91;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  float fVar88;
  float fVar90;
  float fVar92;
  undefined1 auVar86 [16];
  float fVar93;
  float fVar94;
  float fVar95;
  char cVar109;
  char cVar110;
  char cVar112;
  float fVar113;
  float fVar115;
  char cVar116;
  char cVar117;
  float fVar118;
  float fVar120;
  __m128 max;
  char cVar111;
  undefined1 auVar96 [16];
  undefined1 auVar104 [16];
  float fVar114;
  float fVar119;
  float fVar121;
  float fVar122;
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  float fVar123;
  float fVar124;
  float fVar138;
  float fVar139;
  undefined1 auVar125 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  float fVar140;
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  int iVar141;
  short sVar146;
  __m128 _a;
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  float fVar147;
  float fVar148;
  float fVar149;
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  Option opt_q;
  float top_rescale;
  float scale_out;
  Mat m_1;
  Option opt_g;
  float *local_300;
  undefined4 *local_2f0;
  float *local_2e0;
  undefined1 local_2d8 [24];
  ulong uStack_2c0;
  Allocator *local_2b8;
  int iStack_2b0;
  int iStack_2ac;
  undefined1 local_2a8 [16];
  size_t local_298;
  undefined4 *local_288;
  long local_280;
  Mat local_278;
  ulong local_230;
  Mat local_228;
  ulong local_1d8;
  pointer local_1d0;
  int *local_1c8;
  Allocator *local_1c0;
  int local_1b8;
  Allocator *local_1b0;
  int local_1a8;
  int local_1a4;
  int local_1a0;
  int local_19c;
  int local_198;
  ulong local_190;
  Mat local_188;
  size_type local_140;
  long local_138;
  void *local_130;
  int *local_128;
  Allocator *local_120;
  int local_118;
  Allocator *local_110;
  int local_108;
  int local_104;
  int local_100;
  int local_fc;
  int local_f8;
  ulong local_f0;
  undefined1 local_e8 [16];
  vector<float,_std::allocator<float>_> local_d8;
  vector<float,_std::allocator<float>_> local_c0;
  vector<float,_std::allocator<float>_> local_a8;
  vector<float,_std::allocator<float>_> local_90;
  undefined8 local_78;
  Allocator *pAStack_70;
  Allocator *local_68;
  undefined8 uStack_60;
  undefined4 local_58;
  undefined4 uStack_54;
  int iStack_50;
  undefined4 uStack_4c;
  undefined8 local_48;
  undefined8 uStack_40;
  short sVar74;
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar142 [12];
  undefined1 auVar143 [16];
  
  local_188.c = bottom_blob->c;
  local_188.elempack = bottom_blob->elempack;
  local_188.elemsize = bottom_blob->elemsize;
  iVar48 = (this->super_ConvolutionDepthWise).kernel_w;
  iVar56 = (this->super_ConvolutionDepthWise).kernel_h;
  iVar51 = (this->super_ConvolutionDepthWise).dilation_w;
  iVar44 = (this->super_ConvolutionDepthWise).dilation_h;
  local_188.data = bottom_blob->data;
  local_188.refcount = bottom_blob->refcount;
  local_188.allocator = bottom_blob->allocator;
  local_188.dims = bottom_blob->dims;
  local_188.w = bottom_blob->w;
  local_188.h = bottom_blob->h;
  local_188.d = bottom_blob->d;
  local_188.cstep = bottom_blob->cstep;
  if (local_188.refcount != (int *)0x0) {
    LOCK();
    *local_188.refcount = *local_188.refcount + 1;
    UNLOCK();
  }
  if (local_188.elempack == 0 || ((int)local_188.elemsize * 8) / local_188.elempack != 8) {
    uVar57 = (long)(local_188.elempack * local_188.c) /
             (long)(this->super_ConvolutionDepthWise).group;
    local_228.cstep = 0;
    local_228.data = (undefined4 *)0x0;
    local_228.refcount._0_4_ = 0;
    local_228.refcount._4_4_ = 0;
    local_228.elemsize._0_4_ = 0;
    local_228.elemsize._4_4_ = 0;
    local_228.elempack = 0;
    local_228.allocator = (Allocator *)0x0;
    local_228.dims = 0;
    local_228.w = 0;
    local_228.h = 0;
    local_228.d = 0;
    local_228.c = 0;
    Mat::create(&local_228,local_188.elempack * local_188.c,4,(Allocator *)0x0);
    lVar41 = (long)(this->super_ConvolutionDepthWise).group;
    if (0 < lVar41) {
      pvVar12 = (this->super_ConvolutionDepthWise).bottom_blob_int8_scales.data;
      lVar52 = 0;
      puVar45 = (undefined4 *)local_228.data;
      do {
        if (0 < (int)uVar57) {
          uVar5 = *(undefined4 *)((long)pvVar12 + lVar52 * 4);
          uVar50 = uVar57 & 0xffffffff;
          do {
            *puVar45 = uVar5;
            puVar45 = puVar45 + 1;
            uVar54 = (int)uVar50 - 1;
            uVar50 = (ulong)uVar54;
          } while (uVar54 != 0);
        }
        lVar52 = lVar52 + 1;
      } while (lVar52 != lVar41);
    }
    uVar18 = opt->lightmode;
    uVar19 = opt->use_shader_pack8;
    uVar20 = opt->use_subgroup_ops;
    uVar21 = opt->use_reserved_0;
    uVar22 = opt->num_threads;
    local_2d8._4_4_ = uVar22;
    local_2d8[3] = uVar21;
    local_2d8[2] = uVar20;
    local_2d8[1] = uVar19;
    local_2d8[0] = uVar18;
    local_2d8._16_8_ = opt->workspace_allocator;
    uStack_2c0._0_4_ = opt->openmp_blocktime;
    unique0x00006c8c = opt->use_winograd_convolution;
    unique0x00006c8d = opt->use_sgemm_convolution;
    unique0x00006c8e = opt->use_int8_inference;
    unique0x00006c8f = opt->use_vulkan_compute;
    local_2b8 = *(Allocator **)&opt->use_bf16_storage;
    _iStack_2b0 = *(undefined8 *)&opt->vulkan_device_index;
    local_2a8._0_4_ = opt->flush_denormals;
    local_2a8[4] = opt->use_local_pool_allocator;
    local_2a8[5] = opt->use_shader_local_memory;
    local_2a8[6] = opt->use_cooperative_matrix;
    local_2a8[7] = opt->use_winograd23_convolution;
    local_2a8[8] = opt->use_winograd43_convolution;
    local_2a8[9] = opt->use_winograd63_convolution;
    local_2a8[10] = opt->use_a53_a55_optimized_kernel;
    local_2a8[0xb] = opt->use_fp16_uniform;
    local_2a8[0xc] = opt->use_int8_uniform;
    local_2a8[0xd] = opt->use_reserved_9;
    local_2a8[0xe] = opt->use_reserved_10;
    local_2a8[0xf] = opt->use_reserved_11;
    local_2d8._8_8_ = opt->workspace_allocator;
    quantize_to_int8(bottom_blob,&local_188,&local_228,(Option *)local_2d8);
    bVar58 = local_188.data == (void *)0x0;
    lVar41 = (long)local_188.c * local_188.cstep;
    piVar15 = (int *)CONCAT44(local_228.refcount._4_4_,local_228.refcount._0_4_);
    if (piVar15 != (int *)0x0) {
      LOCK();
      *piVar15 = *piVar15 + -1;
      UNLOCK();
      if (*piVar15 == 0) {
        if (local_228.allocator == (Allocator *)0x0) {
          if ((undefined4 *)local_228.data != (undefined4 *)0x0) {
            free(local_228.data);
          }
        }
        else {
          (*(local_228.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    iVar40 = -100;
    if (bVar58 || lVar41 == 0) goto LAB_003dd52b;
  }
  local_228.cstep = 0;
  local_228.data = (undefined4 *)0x0;
  local_228.refcount._0_4_ = 0;
  local_228.refcount._4_4_ = 0;
  local_228.elemsize._0_4_ = 0;
  local_228.elemsize._4_4_ = 0;
  local_228.elempack = 0;
  local_228.allocator = (Allocator *)0x0;
  local_228.dims = 0;
  local_228.w = 0;
  local_228.h = 0;
  local_228.d = 0;
  local_228.c = 0;
  ConvolutionDepthWise::make_padding(&this->super_ConvolutionDepthWise,&local_188,&local_228,opt);
  iVar60 = local_228.w;
  iVar36 = local_228.elempack;
  iVar40 = -100;
  if (((undefined4 *)local_228.data != (undefined4 *)0x0) &&
     (local_228.cstep * (long)local_228.c != 0)) {
    iVar48 = (~((iVar48 + -1) * iVar51) + local_228.w) / (this->super_ConvolutionDepthWise).stride_w
    ;
    iVar51 = iVar48 + 1;
    uVar57 = (long)(~((iVar56 + -1) * iVar44) + local_228.h) /
             (long)(this->super_ConvolutionDepthWise).stride_h;
    local_230 = uVar57 & 0xffffffff;
    iVar56 = (int)uVar57 + 1;
    uVar54 = local_228.elempack * local_228.c;
    if ((uVar54 == (this->super_ConvolutionDepthWise).group) &&
       (uVar54 == (this->super_ConvolutionDepthWise).num_output)) {
      uVar39 = 8;
      if (opt->use_packing_layout == false) {
        uVar39 = 1;
      }
      if ((uVar54 & 7) != 0) {
        uVar39 = 1;
      }
      iVar44 = (this->super_ConvolutionDepthWise).int8_scale_term;
      uVar38 = uVar39 * 4;
      if (100 < iVar44) {
        uVar38 = uVar39;
      }
      local_288 = (undefined4 *)(long)local_228.c;
      Mat::create(top_blob,iVar51,iVar56,(int)uVar54 / (int)uVar39,(ulong)uVar38,uVar39,
                  opt->blob_allocator);
      iVar40 = -100;
      if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
        iVar40 = 0;
        if (iVar36 == 1) {
          iVar56 = (this->super_ConvolutionDepthWise).kernel_w;
          uVar54 = (this->super_ConvolutionDepthWise).kernel_h;
          opt_00 = (Option *)(ulong)uVar54;
          uVar8 = (this->super_ConvolutionDepthWise).dilation_w;
          uVar9 = (this->super_ConvolutionDepthWise).dilation_h;
          uVar10 = (this->super_ConvolutionDepthWise).stride_w;
          uVar11 = (this->super_ConvolutionDepthWise).stride_h;
          uVar39 = (this->super_ConvolutionDepthWise).activation_type;
          auVar64._0_4_ = -(uint)(uVar8 == 1);
          auVar64._4_4_ = -(uint)(uVar9 == 1);
          auVar64._8_4_ = -(uint)(uVar10 == 1);
          auVar64._12_4_ = -(uint)(uVar11 == 1);
          iVar51 = movmskps(iVar51,auVar64);
          if ((1 < uVar39 || (uVar54 != 3 || iVar56 != 3)) || iVar51 != 0xf) {
            if ((((uVar11 != 2 || uVar10 != 2) || (uVar54 != 3 || iVar56 != 3)) || 1 < uVar39) ||
                (~(byte)iVar51 & 3) != 0) {
              uVar54 = uVar54 * iVar56;
              local_140 = (size_type)(int)uVar54;
              std::vector<int,_std::allocator<int>_>::vector
                        ((vector<int,_std::allocator<int>_> *)local_2d8,local_140,
                         (allocator_type *)&local_278);
              uVar34 = local_2d8._0_8_;
              iVar56 = (this->super_ConvolutionDepthWise).kernel_h;
              if (0 < iVar56) {
                iVar51 = (this->super_ConvolutionDepthWise).dilation_h;
                iVar40 = (this->super_ConvolutionDepthWise).kernel_w;
                iVar36 = (this->super_ConvolutionDepthWise).dilation_w * iVar40;
                iVar37 = 0;
                fVar43 = 0.0;
                iVar46 = 0;
                do {
                  if (0 < iVar40) {
                    lVar41 = 0;
                    do {
                      *(float *)(local_2d8._0_8_ + (iVar46 + lVar41) * 4) = fVar43;
                      fVar43 = (float)((int)fVar43 + (this->super_ConvolutionDepthWise).dilation_w);
                      iVar40 = (this->super_ConvolutionDepthWise).kernel_w;
                      lVar41 = lVar41 + 1;
                    } while ((int)lVar41 < iVar40);
                    iVar46 = iVar46 + (int)lVar41;
                    iVar56 = (this->super_ConvolutionDepthWise).kernel_h;
                  }
                  fVar43 = (float)((int)fVar43 + (iVar60 * iVar51 - iVar36));
                  iVar37 = iVar37 + 1;
                } while (iVar37 < iVar56);
              }
              iVar56 = (this->super_ConvolutionDepthWise).group;
              pfVar55 = (pointer)local_2d8._0_8_;
              if (0 < iVar56) {
                lVar41 = 0;
                lVar52 = 0;
                do {
                  if (-1 < (int)local_230) {
                    local_288 = (undefined4 *)
                                (local_228.cstep * lVar52 *
                                 CONCAT44(local_228.elemsize._4_4_,(undefined4)local_228.elemsize) +
                                (long)local_228.data);
                    local_300 = (float *)(top_blob->elemsize * lVar52 * top_blob->cstep +
                                         (long)top_blob->data);
                    local_280 = (long)local_228.w *
                                CONCAT44(local_228.elemsize._4_4_,(undefined4)local_228.elemsize);
                    pvVar12 = (this->weight_data_tm).data;
                    local_1d8 = 0;
                    local_2e0 = local_300;
                    local_138 = lVar41;
                    do {
                      if (-1 < iVar48) {
                        lVar42 = (long)(int)local_1d8;
                        iVar56 = 0;
                        do {
                          auVar75 = ZEXT812(0);
                          fVar43 = 0.0;
                          if (0 < (int)uVar54) {
                            uVar57 = 0;
                            iVar51 = 0;
                            do {
                              iVar51 = iVar51 + (int)*(char *)((long)pvVar12 + uVar57 + lVar41) *
                                                (int)*(char *)((long)local_288 +
                                                              (long)(int)*(pointer)(uVar34 + uVar57 
                                                  * 4) + (this->super_ConvolutionDepthWise).stride_h
                                                         * lVar42 * local_280 +
                                                         (long)iVar56 *
                                                         (long)(this->super_ConvolutionDepthWise).
                                                               stride_w);
                              uVar57 = uVar57 + 1;
                            } while (uVar54 != uVar57);
                            fVar43 = (float)iVar51;
                          }
                          fVar88 = *(float *)((long)(this->super_ConvolutionDepthWise).
                                                    weight_data_int8_scales.data + lVar52 * 4);
                          if (fVar88 != 0.0) {
                            auVar75._4_8_ = 0;
                            auVar75._0_4_ =
                                 1.0 / (fVar88 * *(float *)((long)(this->super_ConvolutionDepthWise)
                                                                  .bottom_blob_int8_scales.data +
                                                           lVar52 * 4));
                          }
                          uVar57 = auVar75._4_8_;
                          fVar43 = auVar75._0_4_ * fVar43;
                          if ((this->super_ConvolutionDepthWise).bias_term != 0) {
                            fVar43 = fVar43 + *(float *)((long)(this->super_ConvolutionDepthWise).
                                                               bias_data.data + lVar52 * 4);
                          }
                          auVar76._4_8_ = uVar57;
                          auVar76._0_4_ = fVar43;
                          auVar133._12_4_ = 0;
                          auVar133._0_12_ = auVar76;
                          iVar51 = (this->super_ConvolutionDepthWise).activation_type;
                          if (iVar51 - 1U < 6) {
                            auVar77._8_4_ = 0;
                            auVar77._0_8_ = uVar57;
                            switch(iVar51) {
                            case 1:
                              if (fVar43 <= 0.0) {
                                auVar17._12_4_ = 0;
                                auVar17._0_12_ = auVar77;
                                auVar133 = auVar17 << 0x20;
                              }
                              goto LAB_003dd0fb;
                            case 2:
                              fVar88 = (float)(~-(uint)(0.0 < fVar43) &
                                               *(this->super_ConvolutionDepthWise).activation_params
                                                .data | -(uint)(0.0 < fVar43) & 0x3f800000) * fVar43
                              ;
                              break;
                            case 3:
                              pfVar1 = (float *)(this->super_ConvolutionDepthWise).activation_params
                                                .data;
                              fVar88 = *pfVar1;
                              if (fVar43 <= fVar88) {
                                auVar133._4_8_ = uVar57;
                                auVar133._0_4_ = fVar88;
                                auVar133._12_4_ = 0;
                              }
                              fVar88 = pfVar1[1];
                              if (auVar133._0_4_ <= fVar88) {
                                fVar88 = auVar133._0_4_;
                              }
                              break;
                            case 4:
                              if (88.37626 <= fVar43) {
                                auVar151._4_12_ = auVar77;
                                auVar151._0_4_ = 0x42b0c0a5;
                                auVar76 = auVar151._0_12_;
                              }
                              uVar39 = -(uint)(auVar76._0_4_ < -88.37626);
                              fVar43 = expf((float)(uVar39 & 0x42b0c0a5 |
                                                   ~uVar39 & (uint)-auVar76._0_4_));
                              fVar88 = 1.0 / (fVar43 + 1.0);
                              break;
                            case 5:
                              local_e8 = auVar133;
                              fVar43 = expf(fVar43);
                              fVar43 = logf(fVar43 + 1.0);
                              fVar43 = tanhf(fVar43);
                              fVar88 = fVar43 * (float)local_e8._0_4_;
                              break;
                            case 6:
                              pfVar1 = (float *)(this->super_ConvolutionDepthWise).activation_params
                                                .data;
                              fVar90 = *pfVar1;
                              fVar92 = pfVar1[1];
                              fVar95 = -fVar92 / fVar90;
                              fVar88 = 0.0;
                              if (fVar95 <= fVar43) {
                                if (fVar95 + 1.0 / fVar90 < fVar43) goto LAB_003dd0fb;
                                fVar88 = (fVar90 * fVar43 + fVar92) * fVar43;
                              }
                            }
                          }
                          else {
LAB_003dd0fb:
                            fVar88 = auVar133._0_4_;
                          }
                          if (iVar44 < 0x65) {
                            *local_2e0 = fVar88;
                            local_2e0 = local_2e0 + 1;
                          }
                          else {
                            fVar43 = roundf(fVar88 * *(float *)((long)(this->
                                                  super_ConvolutionDepthWise).top_blob_int8_scales.
                                                  data + lVar52 * 4));
                            iVar51 = (int)fVar43;
                            if (iVar51 < -0x7e) {
                              iVar51 = -0x7f;
                            }
                            uVar35 = (undefined1)iVar51;
                            if (0x7e < iVar51) {
                              uVar35 = 0x7f;
                            }
                            *(undefined1 *)local_300 = uVar35;
                            local_300 = (float *)((long)local_300 + 1);
                          }
                          bVar58 = iVar56 != iVar48;
                          iVar56 = iVar56 + 1;
                        } while (bVar58);
                      }
                      iVar56 = (int)local_1d8;
                      local_1d8 = (ulong)(iVar56 + 1);
                    } while (iVar56 != (int)local_230);
                    iVar56 = (this->super_ConvolutionDepthWise).group;
                    lVar41 = local_138;
                  }
                  lVar52 = lVar52 + 1;
                  lVar41 = lVar41 + local_140;
                } while (lVar52 < iVar56);
                pfVar55 = (pointer)local_2d8._0_8_;
              }
              if (pfVar55 != (pointer)0x0) {
                uVar57 = local_2d8._16_8_ - (long)pfVar55;
                goto LAB_003dc40e;
              }
              goto LAB_003dd401;
            }
            if (iVar44 < 0x65) {
              local_2d8._0_16_ = (undefined1  [16])0x0;
              auVar33._8_8_ = 0;
              auVar33._0_8_ = uStack_2c0;
              stack0xfffffffffffffd38 = auVar33 << 0x40;
              iVar48 = (this->super_ConvolutionDepthWise).group;
              if (0 < iVar48) {
                lVar41 = 0;
                do {
                  fVar43 = 1.0 / (*(float *)((long)(this->super_ConvolutionDepthWise).
                                                   weight_data_int8_scales.data + lVar41 * 4) *
                                 *(float *)((long)(this->super_ConvolutionDepthWise).
                                                  bottom_blob_int8_scales.data + lVar41 * 4));
                  local_278.data = (void *)CONCAT44(local_278.data._4_4_,fVar43);
                  if (local_2d8._8_8_ == local_2d8._16_8_) {
                    std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                              ((vector<float,std::allocator<float>> *)local_2d8,
                               (iterator)local_2d8._8_8_,(float *)&local_278);
                    iVar48 = (this->super_ConvolutionDepthWise).group;
                  }
                  else {
                    *(float *)local_2d8._8_8_ = fVar43;
                    local_2d8._8_8_ = (float *)(local_2d8._8_8_ + 4);
                  }
                  lVar41 = lVar41 + 1;
                } while (lVar41 < iVar48);
              }
              std::vector<float,_std::allocator<float>_>::vector
                        (&local_d8,(vector<float,_std::allocator<float>_> *)local_2d8);
              convdw3x3s2_int8_dequant_sse
                        (&local_228,top_blob,(Mat *)(this->weight_data_tm).data,
                         (Mat *)(this->super_ConvolutionDepthWise).bias_data.data,&local_d8,opt_00);
            }
            else {
              local_2d8._0_16_ = (undefined1  [16])0x0;
              auVar31._8_8_ = 0;
              auVar31._0_8_ = uStack_2c0;
              stack0xfffffffffffffd38 = auVar31 << 0x40;
              if (0 < (this->super_ConvolutionDepthWise).group) {
                lVar41 = 0;
                do {
                  fVar43 = *(float *)((long)(this->super_ConvolutionDepthWise).
                                            weight_data_int8_scales.data + lVar41 * 4);
                  fVar88 = 0.0;
                  if (fVar43 != 0.0) {
                    fVar88 = 1.0 / (fVar43 * *(float *)((long)(this->super_ConvolutionDepthWise).
                                                              bottom_blob_int8_scales.data +
                                                       lVar41 * 4));
                  }
                  local_278.data = (void *)CONCAT44(local_278.data._4_4_,fVar88);
                  local_1d0 = (pointer)CONCAT44(local_1d0._4_4_,
                                                *(undefined4 *)
                                                 ((long)(this->super_ConvolutionDepthWise).
                                                        top_blob_int8_scales.data + lVar41 * 4));
                  if (local_2d8._8_8_ == local_2d8._16_8_) {
                    std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                              ((vector<float,std::allocator<float>> *)local_2d8,
                               (iterator)local_2d8._8_8_,(float *)&local_278);
                    iVar53._M_current = (float *)local_2d8._8_8_;
                  }
                  else {
                    *(float *)local_2d8._8_8_ = fVar88;
                    iVar53._M_current = (float *)(local_2d8._8_8_ + 4);
                    local_2d8._8_8_ = iVar53._M_current;
                  }
                  if (iVar53._M_current == (float *)local_2d8._16_8_) {
                    std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                              ((vector<float,std::allocator<float>> *)local_2d8,iVar53,
                               (float *)&local_1d0);
                  }
                  else {
                    *iVar53._M_current = local_1d0._0_4_;
                    local_2d8._8_8_ = iVar53._M_current + 1;
                  }
                  lVar41 = lVar41 + 1;
                } while (lVar41 < (this->super_ConvolutionDepthWise).group);
              }
              std::vector<float,_std::allocator<float>_>::vector
                        (&local_c0,(vector<float,_std::allocator<float>_> *)local_2d8);
              convdw3x3s2_int8_requant_sse
                        (&local_228,top_blob,(Mat *)(this->weight_data_tm).data,
                         (Mat *)(this->super_ConvolutionDepthWise).bias_data.data,&local_c0,opt_00);
              local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start =
                   local_c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start;
              local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage =
                   local_c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
            }
          }
          else if (iVar44 < 0x65) {
            local_2d8._0_16_ = (undefined1  [16])0x0;
            auVar32._8_8_ = 0;
            auVar32._0_8_ = uStack_2c0;
            stack0xfffffffffffffd38 = auVar32 << 0x40;
            iVar48 = (this->super_ConvolutionDepthWise).group;
            if (0 < iVar48) {
              lVar41 = 0;
              do {
                fVar43 = 1.0 / (*(float *)((long)(this->super_ConvolutionDepthWise).
                                                 weight_data_int8_scales.data + lVar41 * 4) *
                               *(float *)((long)(this->super_ConvolutionDepthWise).
                                                bottom_blob_int8_scales.data + lVar41 * 4));
                local_278.data = (void *)CONCAT44(local_278.data._4_4_,fVar43);
                if (local_2d8._8_8_ == local_2d8._16_8_) {
                  std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                            ((vector<float,std::allocator<float>> *)local_2d8,
                             (iterator)local_2d8._8_8_,(float *)&local_278);
                  iVar48 = (this->super_ConvolutionDepthWise).group;
                }
                else {
                  *(float *)local_2d8._8_8_ = fVar43;
                  local_2d8._8_8_ = (float *)(local_2d8._8_8_ + 4);
                }
                lVar41 = lVar41 + 1;
              } while (lVar41 < iVar48);
            }
            std::vector<float,_std::allocator<float>_>::vector
                      (&local_a8,(vector<float,_std::allocator<float>_> *)local_2d8);
            convdw3x3s1_int8_dequant_sse
                      (&local_228,top_blob,(Mat *)(this->weight_data_tm).data,
                       (Mat *)(this->super_ConvolutionDepthWise).bias_data.data,&local_a8,opt_00);
            local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start =
                 local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start;
            local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
          }
          else {
            local_2d8._0_16_ = (undefined1  [16])0x0;
            auVar30._8_8_ = 0;
            auVar30._0_8_ = uStack_2c0;
            stack0xfffffffffffffd38 = auVar30 << 0x40;
            if (0 < (this->super_ConvolutionDepthWise).group) {
              lVar41 = 0;
              do {
                fVar43 = *(float *)((long)(this->super_ConvolutionDepthWise).weight_data_int8_scales
                                          .data + lVar41 * 4);
                fVar88 = 0.0;
                if (fVar43 != 0.0) {
                  fVar88 = 1.0 / (fVar43 * *(float *)((long)(this->super_ConvolutionDepthWise).
                                                            bottom_blob_int8_scales.data +
                                                     lVar41 * 4));
                }
                local_278.data = (void *)CONCAT44(local_278.data._4_4_,fVar88);
                local_1d0 = (pointer)CONCAT44(local_1d0._4_4_,
                                              *(undefined4 *)
                                               ((long)(this->super_ConvolutionDepthWise).
                                                      top_blob_int8_scales.data + lVar41 * 4));
                if (local_2d8._8_8_ == local_2d8._16_8_) {
                  std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                            ((vector<float,std::allocator<float>> *)local_2d8,
                             (iterator)local_2d8._8_8_,(float *)&local_278);
                  iVar53._M_current = (float *)local_2d8._8_8_;
                }
                else {
                  *(float *)local_2d8._8_8_ = fVar88;
                  iVar53._M_current = (float *)(local_2d8._8_8_ + 4);
                  local_2d8._8_8_ = iVar53._M_current;
                }
                if (iVar53._M_current == (float *)local_2d8._16_8_) {
                  std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                            ((vector<float,std::allocator<float>> *)local_2d8,iVar53,
                             (float *)&local_1d0);
                }
                else {
                  *iVar53._M_current = local_1d0._0_4_;
                  local_2d8._8_8_ = iVar53._M_current + 1;
                }
                lVar41 = lVar41 + 1;
              } while (lVar41 < (this->super_ConvolutionDepthWise).group);
            }
            std::vector<float,_std::allocator<float>_>::vector
                      (&local_90,(vector<float,_std::allocator<float>_> *)local_2d8);
            convdw3x3s1_int8_requant_sse
                      (&local_228,top_blob,(Mat *)(this->weight_data_tm).data,
                       (Mat *)(this->super_ConvolutionDepthWise).bias_data.data,&local_90,opt_00);
            local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start =
                 local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start;
            local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
          }
          if (local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl
                                  .super__Vector_impl_data._M_end_of_storage -
                            (long)local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl
                                  .super__Vector_impl_data._M_start);
          }
          if ((pointer)local_2d8._0_8_ != (pointer)0x0) {
            operator_delete((void *)local_2d8._0_8_,local_2d8._16_8_ - local_2d8._0_8_);
          }
          pLVar16 = this->activation;
          if (pLVar16 == (Layer *)0x0) goto LAB_003dd401;
          (*pLVar16->_vptr_Layer[9])(pLVar16,top_blob,opt);
          iVar40 = 0;
        }
        else if (iVar36 == 8) {
          uVar57 = (long)(this->super_ConvolutionDepthWise).kernel_h *
                   (long)(this->super_ConvolutionDepthWise).kernel_w;
          std::vector<int,_std::allocator<int>_>::vector
                    ((vector<int,_std::allocator<int>_> *)local_2d8,uVar57,
                     (allocator_type *)&local_278);
          iVar56 = (this->super_ConvolutionDepthWise).kernel_h;
          if (0 < iVar56) {
            iVar51 = (this->super_ConvolutionDepthWise).dilation_h;
            iVar40 = (this->super_ConvolutionDepthWise).kernel_w;
            iVar36 = (this->super_ConvolutionDepthWise).dilation_w * iVar40;
            iVar37 = 0;
            fVar43 = 0.0;
            iVar46 = 0;
            do {
              if (0 < iVar40) {
                lVar41 = 0;
                do {
                  *(float *)(local_2d8._0_8_ + (iVar37 + lVar41) * 4) = fVar43;
                  fVar43 = (float)((int)fVar43 + (this->super_ConvolutionDepthWise).dilation_w);
                  iVar40 = (this->super_ConvolutionDepthWise).kernel_w;
                  lVar41 = lVar41 + 1;
                } while ((int)lVar41 < iVar40);
                iVar37 = iVar37 + (int)lVar41;
                iVar56 = (this->super_ConvolutionDepthWise).kernel_h;
              }
              fVar43 = (float)((int)fVar43 + (iVar60 * iVar51 - iVar36));
              iVar46 = iVar46 + 1;
            } while (iVar46 < iVar56);
          }
          if (0 < (int)local_288) {
            iVar51 = (int)uVar57 * 8;
            local_280 = CONCAT44(local_280._4_4_,iVar51);
            iVar56 = 0;
            local_2f0 = (undefined4 *)0x0;
            do {
              if (-1 < (int)local_230) {
                pauVar47 = (undefined1 (*) [16])
                           (top_blob->elemsize * (long)local_2f0 * top_blob->cstep +
                           (long)top_blob->data);
                pvVar12 = (this->weight_data_tm).data;
                pauVar49 = pauVar47;
                iVar40 = 0;
                do {
                  if (-1 < iVar48) {
                    iVar36 = 0;
                    do {
                      auVar64 = ZEXT816(0);
                      if ((int)uVar57 < 1) {
                        auVar79 = ZEXT816(0);
                        auVar104 = ZEXT816(0);
                      }
                      else {
                        iVar60 = 0;
                        iVar37 = 0;
                        iVar46 = 0;
                        iVar72 = 0;
                        uVar50 = 0;
                        iVar78 = 0;
                        iVar87 = 0;
                        iVar89 = 0;
                        iVar91 = 0;
                        do {
                          uVar7 = *(ulong *)((long)local_228.data +
                                            (long)(int)*(pointer)(local_2d8._0_8_ + uVar50 * 4) * 8
                                            + (long)(this->super_ConvolutionDepthWise).stride_h *
                                              (long)iVar40 *
                                              (long)local_228.w *
                                              CONCAT44(local_228.elemsize._4_4_,
                                                       (undefined4)local_228.elemsize) +
                                              (long)((this->super_ConvolutionDepthWise).stride_w *
                                                     iVar36 * 8) +
                                              local_228.cstep * (long)local_2f0 *
                                              CONCAT44(local_228.elemsize._4_4_,
                                                       (undefined4)local_228.elemsize));
                          cVar109 = (char)(uVar7 >> 8);
                          cVar110 = (char)(uVar7 >> 0x10);
                          cVar111 = (char)(uVar7 >> 0x18);
                          cVar112 = (char)(uVar7 >> 0x20);
                          cVar116 = (char)(uVar7 >> 0x28);
                          cVar117 = (char)(uVar7 >> 0x30);
                          auVar103._8_6_ = 0;
                          auVar103._0_8_ = uVar7;
                          auVar103[0xe] = (char)(uVar7 >> 0x38);
                          auVar103[0xf] = -((long)uVar7 < 0);
                          auVar102._14_2_ = auVar103._14_2_;
                          auVar102._8_5_ = 0;
                          auVar102._0_8_ = uVar7;
                          auVar102[0xd] = -(cVar117 < '\0');
                          auVar101._13_3_ = auVar102._13_3_;
                          auVar101._8_4_ = 0;
                          auVar101._0_8_ = uVar7;
                          auVar101[0xc] = cVar117;
                          auVar100._12_4_ = auVar101._12_4_;
                          auVar100._8_3_ = 0;
                          auVar100._0_8_ = uVar7;
                          auVar100[0xb] = -(cVar116 < '\0');
                          auVar99._11_5_ = auVar100._11_5_;
                          auVar99._8_2_ = 0;
                          auVar99._0_8_ = uVar7;
                          auVar99[10] = cVar116;
                          auVar98._10_6_ = auVar99._10_6_;
                          auVar98[8] = 0;
                          auVar98._0_8_ = uVar7;
                          auVar98[9] = -(cVar112 < '\0');
                          auVar97._9_7_ = auVar98._9_7_;
                          auVar97[8] = cVar112;
                          auVar97._0_8_ = uVar7;
                          Var25 = CONCAT91(CONCAT81(auVar97._8_8_,-(cVar111 < '\0')),cVar111);
                          auVar24._2_10_ = Var25;
                          auVar24[1] = -(cVar110 < '\0');
                          auVar24[0] = cVar110;
                          auVar23._2_12_ = auVar24;
                          auVar23[1] = -(cVar109 < '\0');
                          auVar23[0] = cVar109;
                          auVar96._0_2_ = CONCAT11(-((char)uVar7 < '\0'),(char)uVar7);
                          auVar96._2_14_ = auVar23;
                          uVar7 = *(ulong *)((long)pvVar12 + uVar50 * 8 + (long)iVar56);
                          cVar109 = (char)(uVar7 >> 8);
                          cVar110 = (char)(uVar7 >> 0x10);
                          cVar111 = (char)(uVar7 >> 0x18);
                          cVar112 = (char)(uVar7 >> 0x20);
                          cVar116 = (char)(uVar7 >> 0x28);
                          cVar117 = (char)(uVar7 >> 0x30);
                          auVar132._8_6_ = 0;
                          auVar132._0_8_ = uVar7;
                          auVar132[0xe] = (char)(uVar7 >> 0x38);
                          auVar132[0xf] = -((long)uVar7 < 0);
                          auVar131._14_2_ = auVar132._14_2_;
                          auVar131._8_5_ = 0;
                          auVar131._0_8_ = uVar7;
                          auVar131[0xd] = -(cVar117 < '\0');
                          auVar130._13_3_ = auVar131._13_3_;
                          auVar130._8_4_ = 0;
                          auVar130._0_8_ = uVar7;
                          auVar130[0xc] = cVar117;
                          auVar129._12_4_ = auVar130._12_4_;
                          auVar129._8_3_ = 0;
                          auVar129._0_8_ = uVar7;
                          auVar129[0xb] = -(cVar116 < '\0');
                          auVar128._11_5_ = auVar129._11_5_;
                          auVar128._8_2_ = 0;
                          auVar128._0_8_ = uVar7;
                          auVar128[10] = cVar116;
                          auVar127._10_6_ = auVar128._10_6_;
                          auVar127[8] = 0;
                          auVar127._0_8_ = uVar7;
                          auVar127[9] = -(cVar112 < '\0');
                          auVar126._9_7_ = auVar127._9_7_;
                          auVar126[8] = cVar112;
                          auVar126._0_8_ = uVar7;
                          Var28 = CONCAT91(CONCAT81(auVar126._8_8_,-(cVar111 < '\0')),cVar111);
                          auVar27._2_10_ = Var28;
                          auVar27[1] = -(cVar110 < '\0');
                          auVar27[0] = cVar110;
                          auVar26._2_12_ = auVar27;
                          auVar26[1] = -(cVar109 < '\0');
                          auVar26[0] = cVar109;
                          auVar125._0_2_ = CONCAT11(-((char)uVar7 < '\0'),(char)uVar7);
                          auVar125._2_14_ = auVar26;
                          sVar146 = (short)Var28 * (short)Var25;
                          auVar133 = pmulhw(auVar125,auVar96);
                          iVar141 = CONCAT22(auVar133._6_2_,sVar146);
                          Var25 = CONCAT64(CONCAT42(iVar141,auVar133._4_2_),
                                           CONCAT22(auVar27._0_2_ * auVar24._0_2_,sVar146));
                          auVar29._4_8_ = (long)((unkuint10)Var25 >> 0x10);
                          auVar29._2_2_ = auVar133._2_2_;
                          auVar29._0_2_ = auVar26._0_2_ * auVar23._0_2_;
                          iVar60 = iVar60 + CONCAT22(auVar133._0_2_,auVar125._0_2_ * auVar96._0_2_);
                          iVar37 = iVar37 + auVar29._0_4_;
                          iVar46 = iVar46 + (int)((unkuint10)Var25 >> 0x10);
                          iVar72 = iVar72 + iVar141;
                          iVar141 = CONCAT22(auVar133._8_2_,auVar126._8_2_ * auVar97._8_2_);
                          auVar142._0_8_ =
                               CONCAT26(auVar133._10_2_,
                                        CONCAT24(auVar128._10_2_ * auVar99._10_2_,iVar141));
                          auVar142._8_2_ = auVar130._12_2_ * auVar101._12_2_;
                          auVar142._10_2_ = auVar133._12_2_;
                          auVar143._12_2_ = auVar131._14_2_ * auVar102._14_2_;
                          auVar143._0_12_ = auVar142;
                          auVar143._14_2_ = auVar133._14_2_;
                          iVar78 = iVar78 + iVar141;
                          iVar87 = iVar87 + (int)((ulong)auVar142._0_8_ >> 0x20);
                          iVar89 = iVar89 + auVar142._8_4_;
                          iVar91 = iVar91 + auVar143._12_4_;
                          uVar50 = uVar50 + 1;
                        } while ((uVar57 & 0xffffffff) != uVar50);
                        auVar104._0_4_ = (float)iVar60;
                        auVar104._4_4_ = (float)iVar37;
                        auVar104._8_4_ = (float)iVar46;
                        auVar104._12_4_ = (float)iVar72;
                        auVar79._0_4_ = (float)iVar78;
                        auVar79._4_4_ = (float)iVar87;
                        auVar79._8_4_ = (float)iVar89;
                        auVar79._12_4_ = (float)iVar91;
                      }
                      pvVar13 = (this->super_ConvolutionDepthWise).weight_data_int8_scales.data;
                      pvVar14 = (this->super_ConvolutionDepthWise).bottom_blob_int8_scales.data;
                      pfVar4 = (float *)((long)pvVar14 + (long)local_2f0 * 0x20);
                      pfVar2 = (float *)((long)pvVar14 + (long)local_2f0 * 0x20 + 0x10);
                      pfVar1 = (float *)((long)pvVar13 + (long)local_2f0 * 0x20);
                      pfVar3 = (float *)((long)pvVar13 + (long)local_2f0 * 0x20 + 0x10);
                      auVar134._0_4_ = *pfVar4 * *pfVar1;
                      auVar134._4_4_ = pfVar4[1] * pfVar1[1];
                      auVar134._8_4_ = pfVar4[2] * pfVar1[2];
                      auVar134._12_4_ = pfVar4[3] * pfVar1[3];
                      auVar133 = rcpps(auVar134,auVar134);
                      auVar150._0_4_ = *pfVar2 * *pfVar3;
                      auVar150._4_4_ = pfVar2[1] * pfVar3[1];
                      auVar150._8_4_ = pfVar2[2] * pfVar3[2];
                      auVar150._12_4_ = pfVar2[3] * pfVar3[3];
                      auVar151 = rcpps(auVar150,auVar150);
                      auVar62._0_4_ =
                           (float)(-(uint)(*pfVar1 != 0.0) & auVar133._0_4_) * auVar104._0_4_;
                      auVar62._4_4_ =
                           (float)(-(uint)(pfVar1[1] != 0.0) & auVar133._4_4_) * auVar104._4_4_;
                      auVar62._8_4_ =
                           (float)(-(uint)(pfVar1[2] != 0.0) & auVar133._8_4_) * auVar104._8_4_;
                      auVar62._12_4_ =
                           (float)(-(uint)(pfVar1[3] != 0.0) & auVar133._12_4_) * auVar104._12_4_;
                      auVar145._0_4_ =
                           (float)(-(uint)(*pfVar3 != 0.0) & auVar151._0_4_) * auVar79._0_4_;
                      auVar145._4_4_ =
                           (float)(-(uint)(pfVar3[1] != 0.0) & auVar151._4_4_) * auVar79._4_4_;
                      auVar145._8_4_ =
                           (float)(-(uint)(pfVar3[2] != 0.0) & auVar151._8_4_) * auVar79._8_4_;
                      auVar145._12_4_ =
                           (float)(-(uint)(pfVar3[3] != 0.0) & auVar151._12_4_) * auVar79._12_4_;
                      if ((this->super_ConvolutionDepthWise).bias_term != 0) {
                        pvVar13 = (this->super_ConvolutionDepthWise).bias_data.data;
                        auVar133 = *(undefined1 (*) [16])((long)pvVar13 + (long)local_2f0 * 0x20);
                        auVar151 = *(undefined1 (*) [16])
                                    ((long)pvVar13 + (long)local_2f0 * 0x20 + 0x10);
                        auVar62._0_4_ = auVar62._0_4_ + auVar133._0_4_;
                        auVar62._4_4_ = auVar62._4_4_ + auVar133._4_4_;
                        auVar62._8_4_ = auVar62._8_4_ + auVar133._8_4_;
                        auVar62._12_4_ = auVar62._12_4_ + auVar133._12_4_;
                        auVar145._0_4_ = auVar145._0_4_ + auVar151._0_4_;
                        auVar145._4_4_ = auVar145._4_4_ + auVar151._4_4_;
                        auVar145._8_4_ = auVar145._8_4_ + auVar151._8_4_;
                        auVar145._12_4_ = auVar145._12_4_ + auVar151._12_4_;
                      }
                      fVar43 = auVar62._0_4_;
                      fVar88 = auVar62._4_4_;
                      fVar90 = auVar62._8_4_;
                      fVar92 = auVar62._12_4_;
                      fVar95 = auVar145._4_4_;
                      fVar115 = auVar145._8_4_;
                      fVar120 = auVar145._12_4_;
                      fVar123 = (float)DAT_005a4e20;
                      fVar147 = DAT_005a4e20._4_4_;
                      fVar148 = DAT_005a4e20._8_4_;
                      fVar149 = DAT_005a4e20._12_4_;
                      switch((this->super_ConvolutionDepthWise).activation_type) {
                      case 1:
                        auVar62 = maxps(auVar62,auVar64);
                        auVar145 = maxps(auVar145,auVar64);
                        break;
                      case 2:
                        auVar151 = maxps(auVar62,auVar64);
                        auVar133 = minps(auVar62,auVar64);
                        fVar43 = *(this->super_ConvolutionDepthWise).activation_params.data;
                        auVar62._0_4_ = auVar133._0_4_ * fVar43 + auVar151._0_4_;
                        auVar62._4_4_ = auVar133._4_4_ * fVar43 + auVar151._4_4_;
                        auVar62._8_4_ = auVar133._8_4_ * fVar43 + auVar151._8_4_;
                        auVar62._12_4_ = auVar133._12_4_ * fVar43 + auVar151._12_4_;
                        auVar133 = maxps(auVar145,auVar64);
                        auVar64 = minps(auVar145,auVar64);
                        auVar145._0_4_ = auVar64._0_4_ * fVar43 + auVar133._0_4_;
                        auVar145._4_4_ = auVar64._4_4_ * fVar43 + auVar133._4_4_;
                        auVar145._8_4_ = auVar64._8_4_ * fVar43 + auVar133._8_4_;
                        auVar145._12_4_ = auVar64._12_4_ * fVar43 + auVar133._12_4_;
                        break;
                      case 3:
                        puVar45 = (undefined4 *)
                                  (this->super_ConvolutionDepthWise).activation_params.data;
                        uVar5 = *puVar45;
                        uVar6 = puVar45[1];
                        auVar82._4_4_ = uVar5;
                        auVar82._0_4_ = uVar5;
                        auVar82._8_4_ = uVar5;
                        auVar82._12_4_ = uVar5;
                        auVar107._4_4_ = uVar6;
                        auVar107._0_4_ = uVar6;
                        auVar107._8_4_ = uVar6;
                        auVar107._12_4_ = uVar6;
                        auVar64 = maxps(auVar62,auVar82);
                        auVar62 = minps(auVar64,auVar107);
                        auVar64 = maxps(auVar145,auVar82);
                        auVar145 = minps(auVar64,auVar107);
                        break;
                      case 4:
                        auVar61._0_8_ = auVar62._0_8_ ^ 0x8000000080000000;
                        auVar61._8_4_ = -fVar90;
                        auVar61._12_4_ = -fVar92;
                        auVar64 = minps(auVar61,_DAT_005a4de0);
                        auVar64 = maxps(auVar64,_DAT_005a4df0);
                        fVar43 = auVar64._0_4_ * 1.442695 + 0.5;
                        fVar88 = auVar64._4_4_ * 1.442695 + 0.5;
                        fVar90 = auVar64._8_4_ * 1.442695 + 0.5;
                        fVar92 = auVar64._12_4_ * 1.442695 + 0.5;
                        fVar95 = (float)(int)fVar43;
                        fVar124 = (float)(int)fVar88;
                        fVar138 = (float)(int)fVar90;
                        fVar139 = (float)(int)fVar92;
                        fVar95 = fVar95 - (float)(-(uint)(fVar43 < fVar95) & (uint)fVar123);
                        fVar124 = fVar124 - (float)(-(uint)(fVar88 < fVar124) & (uint)fVar147);
                        fVar138 = fVar138 - (float)(-(uint)(fVar90 < fVar138) & (uint)fVar148);
                        fVar139 = fVar139 - (float)(-(uint)(fVar92 < fVar139) & (uint)fVar149);
                        fVar43 = auVar64._0_4_ - fVar95 * (float)DAT_005a4e30;
                        fVar88 = auVar64._4_4_ - fVar124 * DAT_005a4e30._4_4_;
                        fVar90 = auVar64._8_4_ - fVar138 * DAT_005a4e30._8_4_;
                        fVar92 = auVar64._12_4_ - fVar139 * DAT_005a4e30._12_4_;
                        auVar108._0_4_ =
                             (float)((int)fVar95 * 0x800000 + (int)fVar123) *
                             (fVar43 + fVar123 +
                             (((((fVar43 * (float)DAT_005a4e40 + 0.0013981999) * fVar43 +
                                0.008333452) * fVar43 + 0.041665796) * fVar43 + (float)DAT_005a4e80)
                              * fVar43 + 0.5) * fVar43 * fVar43) + fVar123;
                        auVar108._4_4_ =
                             (float)((int)fVar124 * 0x800000 + (int)fVar147) *
                             (fVar88 + fVar147 +
                             (((((fVar88 * DAT_005a4e40._4_4_ + 0.0013981999) * fVar88 + 0.008333452
                                ) * fVar88 + 0.041665796) * fVar88 + DAT_005a4e80._4_4_) * fVar88 +
                             0.5) * fVar88 * fVar88) + fVar147;
                        auVar108._8_4_ =
                             (float)((int)fVar138 * 0x800000 + (int)fVar148) *
                             (fVar90 + fVar148 +
                             (((((fVar90 * DAT_005a4e40._8_4_ + 0.0013981999) * fVar90 + 0.008333452
                                ) * fVar90 + 0.041665796) * fVar90 + DAT_005a4e80._8_4_) * fVar90 +
                             0.5) * fVar90 * fVar90) + fVar148;
                        auVar108._12_4_ =
                             (float)((int)fVar139 * 0x800000 + (int)fVar149) *
                             (fVar92 + fVar149 +
                             (((((fVar92 * DAT_005a4e40._12_4_ + 0.0013981999) * fVar92 +
                                0.008333452) * fVar92 + 0.041665796) * fVar92 + DAT_005a4e80._12_4_)
                              * fVar92 + 0.5) * fVar92 * fVar92) + fVar149;
                        auVar62 = divps(_DAT_005a4e20,auVar108);
                        auVar144._0_8_ = auVar145._0_8_ ^ 0x8000000080000000;
                        auVar144._8_4_ = -fVar115;
                        auVar144._12_4_ = -fVar120;
                        auVar64 = minps(auVar144,_DAT_005a4de0);
                        auVar64 = maxps(auVar64,_DAT_005a4df0);
                        fVar95 = auVar64._0_4_ * 1.442695 + 0.5;
                        fVar115 = auVar64._4_4_ * 1.442695 + 0.5;
                        fVar120 = auVar64._8_4_ * 1.442695 + 0.5;
                        fVar124 = auVar64._12_4_ * 1.442695 + 0.5;
                        fVar43 = (float)(int)fVar95;
                        fVar88 = (float)(int)fVar115;
                        fVar90 = (float)(int)fVar120;
                        fVar92 = (float)(int)fVar124;
                        fVar43 = fVar43 - (float)(-(uint)(fVar95 < fVar43) & (uint)fVar123);
                        fVar88 = fVar88 - (float)(-(uint)(fVar115 < fVar88) & (uint)fVar147);
                        fVar90 = fVar90 - (float)(-(uint)(fVar120 < fVar90) & (uint)fVar148);
                        fVar92 = fVar92 - (float)(-(uint)(fVar124 < fVar92) & (uint)fVar149);
                        fVar95 = auVar64._0_4_ - fVar43 * (float)DAT_005a4e30;
                        fVar115 = auVar64._4_4_ - fVar88 * DAT_005a4e30._4_4_;
                        fVar120 = auVar64._8_4_ - fVar90 * DAT_005a4e30._8_4_;
                        fVar124 = auVar64._12_4_ - fVar92 * DAT_005a4e30._12_4_;
                        auVar83._0_4_ =
                             (float)((int)fVar43 * 0x800000 + (int)fVar123) *
                             (fVar95 + fVar123 +
                             (((((fVar95 * (float)DAT_005a4e40 + 0.0013981999) * fVar95 +
                                0.008333452) * fVar95 + 0.041665796) * fVar95 + (float)DAT_005a4e80)
                              * fVar95 + 0.5) * fVar95 * fVar95) + fVar123;
                        auVar83._4_4_ =
                             (float)((int)fVar88 * 0x800000 + (int)fVar147) *
                             (fVar115 + fVar147 +
                             (((((fVar115 * DAT_005a4e40._4_4_ + 0.0013981999) * fVar115 +
                                0.008333452) * fVar115 + 0.041665796) * fVar115 + DAT_005a4e80._4_4_
                              ) * fVar115 + 0.5) * fVar115 * fVar115) + fVar147;
                        auVar83._8_4_ =
                             (float)((int)fVar90 * 0x800000 + (int)fVar148) *
                             (fVar120 + fVar148 +
                             (((((fVar120 * DAT_005a4e40._8_4_ + 0.0013981999) * fVar120 +
                                0.008333452) * fVar120 + 0.041665796) * fVar120 + DAT_005a4e80._8_4_
                              ) * fVar120 + 0.5) * fVar120 * fVar120) + fVar148;
                        auVar83._12_4_ =
                             (float)((int)fVar92 * 0x800000 + (int)fVar149) *
                             (fVar124 + fVar149 +
                             (((((fVar124 * DAT_005a4e40._12_4_ + 0.0013981999) * fVar124 +
                                0.008333452) * fVar124 + 0.041665796) * fVar124 +
                              DAT_005a4e80._12_4_) * fVar124 + 0.5) * fVar124 * fVar124) + fVar149;
                        auVar145 = divps(_DAT_005a4e20,auVar83);
                        break;
                      case 5:
                        auVar64 = minps(auVar62,_DAT_005a4de0);
                        auVar64 = maxps(auVar64,_DAT_005a4df0);
                        fVar124 = auVar64._0_4_ * 1.442695 + 0.5;
                        fVar138 = auVar64._4_4_ * 1.442695 + 0.5;
                        fVar139 = auVar64._8_4_ * 1.442695 + 0.5;
                        fVar140 = auVar64._12_4_ * 1.442695 + 0.5;
                        fVar93 = (float)(int)fVar124;
                        fVar113 = (float)(int)fVar138;
                        fVar118 = (float)(int)fVar139;
                        fVar121 = (float)(int)fVar140;
                        fVar93 = fVar93 - (float)(-(uint)(fVar124 < fVar93) & (uint)fVar123);
                        fVar113 = fVar113 - (float)(-(uint)(fVar138 < fVar113) & (uint)fVar147);
                        fVar118 = fVar118 - (float)(-(uint)(fVar139 < fVar118) & (uint)fVar148);
                        fVar121 = fVar121 - (float)(-(uint)(fVar140 < fVar121) & (uint)fVar149);
                        fVar124 = auVar64._0_4_ - fVar93 * 0.6931472;
                        fVar138 = auVar64._4_4_ - fVar113 * 0.6931472;
                        fVar139 = auVar64._8_4_ - fVar118 * 0.6931472;
                        fVar140 = auVar64._12_4_ - fVar121 * 0.6931472;
                        auVar152._0_4_ =
                             (float)((int)fVar93 * 0x800000 + (int)fVar123) *
                             (fVar124 + fVar123 +
                             (((((fVar124 * 0.00019875691 + 0.0013981999) * fVar124 + 0.008333452) *
                                fVar124 + 0.041665796) * fVar124 + 0.16666666) * fVar124 + 0.5) *
                             fVar124 * fVar124) + fVar123;
                        auVar152._4_4_ =
                             (float)((int)fVar113 * 0x800000 + (int)fVar147) *
                             (fVar138 + fVar147 +
                             (((((fVar138 * 0.00019875691 + 0.0013981999) * fVar138 + 0.008333452) *
                                fVar138 + 0.041665796) * fVar138 + 0.16666666) * fVar138 + 0.5) *
                             fVar138 * fVar138) + fVar147;
                        auVar152._8_4_ =
                             (float)((int)fVar118 * 0x800000 + (int)fVar148) *
                             (fVar139 + fVar148 +
                             (((((fVar139 * 0.00019875691 + 0.0013981999) * fVar139 + 0.008333452) *
                                fVar139 + 0.041665796) * fVar139 + 0.16666666) * fVar139 + 0.5) *
                             fVar139 * fVar139) + fVar148;
                        auVar152._12_4_ =
                             (float)((int)fVar121 * 0x800000 + (int)fVar149) *
                             (fVar140 + fVar149 +
                             (((((fVar140 * 0.00019875691 + 0.0013981999) * fVar140 + 0.008333452) *
                                fVar140 + 0.041665796) * fVar140 + 0.16666666) * fVar140 + 0.5) *
                             fVar140 * fVar140) + fVar149;
                        auVar64 = maxps(auVar152,_DAT_005a4e90);
                        fVar124 = (float)(auVar64._0_4_ & 0x807fffff | 0x3f000000);
                        fVar139 = (float)(auVar64._4_4_ & 0x807fffff | 0x3f000000);
                        fVar93 = (float)(auVar64._8_4_ & 0x807fffff | 0x3f000000);
                        fVar118 = (float)(auVar64._12_4_ & 0x807fffff | 0x3f000000);
                        fVar138 = fVar124 + -1.0 +
                                  (float)(-(uint)(fVar124 < 0.70710677) & (uint)fVar124);
                        fVar140 = fVar139 + -1.0 +
                                  (float)(-(uint)(fVar139 < 0.70710677) & (uint)fVar139);
                        fVar113 = fVar93 + -1.0 +
                                  (float)(-(uint)(fVar93 < 0.70710677) & (uint)fVar93);
                        fVar121 = fVar118 + -1.0 +
                                  (float)(-(uint)(fVar118 < 0.70710677) & (uint)fVar118);
                        auVar80._0_8_ =
                             CONCAT44(-(uint)(auVar152._4_4_ <= 0.0),-(uint)(auVar152._0_4_ <= 0.0))
                             & 0x7fffffff7fffffff;
                        auVar80._8_4_ = -(uint)(auVar152._8_4_ <= 0.0) & 0x7fffffff;
                        auVar80._12_4_ = -(uint)(auVar152._12_4_ <= 0.0) & 0x7fffffff;
                        auVar135._0_4_ =
                             ~-(uint)(auVar152._0_4_ <= 0.0) &
                             (uint)((((float)(int)((auVar64._0_4_ >> 0x17) - 0x7e) -
                                     (float)(-(uint)(fVar124 < 0.70710677) & (uint)fVar123)) *
                                     0.6931472 + fVar138 +
                                    (((((((((fVar138 * 0.070376836 + -0.1151461) * fVar138 +
                                           0.116769984) * fVar138 + -0.12420141) * fVar138 +
                                         0.14249323) * fVar138 + -0.16668057) * fVar138 + 0.20000714
                                       ) * fVar138 + -0.24999994) * fVar138 + 0.3333333) * fVar138 +
                                    -0.5) * fVar138 * fVar138) * -2.0);
                        auVar135._4_4_ =
                             ~-(uint)(auVar152._4_4_ <= 0.0) &
                             (uint)((((float)(int)((auVar64._4_4_ >> 0x17) - 0x7e) -
                                     (float)(-(uint)(fVar139 < 0.70710677) & (uint)fVar147)) *
                                     0.6931472 + fVar140 +
                                    (((((((((fVar140 * 0.070376836 + -0.1151461) * fVar140 +
                                           0.116769984) * fVar140 + -0.12420141) * fVar140 +
                                         0.14249323) * fVar140 + -0.16668057) * fVar140 + 0.20000714
                                       ) * fVar140 + -0.24999994) * fVar140 + 0.3333333) * fVar140 +
                                    -0.5) * fVar140 * fVar140) * -2.0);
                        auVar135._8_4_ =
                             ~-(uint)(auVar152._8_4_ <= 0.0) &
                             (uint)((((float)(int)((auVar64._8_4_ >> 0x17) - 0x7e) -
                                     (float)(-(uint)(fVar93 < 0.70710677) & (uint)fVar148)) *
                                     0.6931472 + fVar113 +
                                    (((((((((fVar113 * 0.070376836 + -0.1151461) * fVar113 +
                                           0.116769984) * fVar113 + -0.12420141) * fVar113 +
                                         0.14249323) * fVar113 + -0.16668057) * fVar113 + 0.20000714
                                       ) * fVar113 + -0.24999994) * fVar113 + 0.3333333) * fVar113 +
                                    -0.5) * fVar113 * fVar113) * -2.0);
                        auVar135._12_4_ =
                             ~-(uint)(auVar152._12_4_ <= 0.0) &
                             (uint)((((float)(int)((auVar64._12_4_ >> 0x17) - 0x7e) -
                                     (float)(-(uint)(fVar118 < 0.70710677) & (uint)fVar149)) *
                                     0.6931472 + fVar121 +
                                    (((((((((fVar121 * 0.070376836 + -0.1151461) * fVar121 +
                                           0.116769984) * fVar121 + -0.12420141) * fVar121 +
                                         0.14249323) * fVar121 + -0.16668057) * fVar121 + 0.20000714
                                       ) * fVar121 + -0.24999994) * fVar121 + 0.3333333) * fVar121 +
                                    -0.5) * fVar121 * fVar121) * -2.0);
                        auVar64 = minps(auVar135 | auVar80,_DAT_005a4de0);
                        auVar64 = maxps(auVar64,_DAT_005a4df0);
                        fVar124 = (float)DAT_005a4e00;
                        fVar138 = DAT_005a4e00._4_4_;
                        fVar139 = DAT_005a4e00._8_4_;
                        fVar140 = DAT_005a4e00._12_4_;
                        fVar94 = auVar64._0_4_ * fVar124 + 0.5;
                        fVar114 = auVar64._4_4_ * fVar138 + 0.5;
                        fVar119 = auVar64._8_4_ * fVar139 + 0.5;
                        fVar122 = auVar64._12_4_ * fVar140 + 0.5;
                        fVar93 = (float)(int)fVar94;
                        fVar113 = (float)(int)fVar114;
                        fVar118 = (float)(int)fVar119;
                        fVar121 = (float)(int)fVar122;
                        fVar93 = fVar93 - (float)(-(uint)(fVar94 < fVar93) & (uint)fVar123);
                        fVar113 = fVar113 - (float)(-(uint)(fVar114 < fVar113) & (uint)fVar147);
                        fVar118 = fVar118 - (float)(-(uint)(fVar119 < fVar118) & (uint)fVar148);
                        fVar121 = fVar121 - (float)(-(uint)(fVar122 < fVar121) & (uint)fVar149);
                        fVar94 = auVar64._0_4_ - fVar93 * 0.6931472;
                        fVar114 = auVar64._4_4_ - fVar113 * 0.6931472;
                        fVar119 = auVar64._8_4_ - fVar118 * 0.6931472;
                        fVar122 = auVar64._12_4_ - fVar121 * 0.6931472;
                        auVar105._0_4_ =
                             (float)((int)fVar93 * 0x800000 + (int)fVar123) *
                             (fVar94 + fVar123 +
                             (((((fVar94 * 0.00019875691 + 0.0013981999) * fVar94 + 0.008333452) *
                                fVar94 + 0.041665796) * fVar94 + 0.16666666) * fVar94 + 0.5) *
                             fVar94 * fVar94) + fVar123;
                        auVar105._4_4_ =
                             (float)((int)fVar113 * 0x800000 + (int)fVar147) *
                             (fVar114 + fVar147 +
                             (((((fVar114 * 0.00019875691 + 0.0013981999) * fVar114 + 0.008333452) *
                                fVar114 + 0.041665796) * fVar114 + 0.16666666) * fVar114 + 0.5) *
                             fVar114 * fVar114) + fVar147;
                        auVar105._8_4_ =
                             (float)((int)fVar118 * 0x800000 + (int)fVar148) *
                             (fVar119 + fVar148 +
                             (((((fVar119 * 0.00019875691 + 0.0013981999) * fVar119 + 0.008333452) *
                                fVar119 + 0.041665796) * fVar119 + 0.16666666) * fVar119 + 0.5) *
                             fVar119 * fVar119) + fVar148;
                        auVar105._12_4_ =
                             (float)((int)fVar121 * 0x800000 + (int)fVar149) *
                             (fVar122 + fVar149 +
                             (((((fVar122 * 0.00019875691 + 0.0013981999) * fVar122 + 0.008333452) *
                                fVar122 + 0.041665796) * fVar122 + 0.16666666) * fVar122 + 0.5) *
                             fVar122 * fVar122) + fVar149;
                        auVar64 = divps(_DAT_005a5aa0,auVar105);
                        auVar62._0_4_ = fVar43 * (auVar64._0_4_ + -1.0);
                        auVar62._4_4_ = fVar88 * (auVar64._4_4_ + -1.0);
                        auVar62._8_4_ = fVar90 * (auVar64._8_4_ + -1.0);
                        auVar62._12_4_ = fVar92 * (auVar64._12_4_ + -1.0);
                        auVar64 = minps(auVar145,_DAT_005a4de0);
                        auVar64 = maxps(auVar64,_DAT_005a4df0);
                        fVar43 = auVar64._0_4_ * fVar124 + 0.5;
                        fVar88 = auVar64._4_4_ * fVar138 + 0.5;
                        fVar90 = auVar64._8_4_ * fVar139 + 0.5;
                        fVar92 = auVar64._12_4_ * fVar140 + 0.5;
                        fVar93 = (float)(int)fVar43;
                        fVar113 = (float)(int)fVar88;
                        fVar118 = (float)(int)fVar90;
                        fVar121 = (float)(int)fVar92;
                        fVar93 = fVar93 - (float)(-(uint)(fVar43 < fVar93) & (uint)fVar123);
                        fVar113 = fVar113 - (float)(-(uint)(fVar88 < fVar113) & (uint)fVar147);
                        fVar118 = fVar118 - (float)(-(uint)(fVar90 < fVar118) & (uint)fVar148);
                        fVar121 = fVar121 - (float)(-(uint)(fVar92 < fVar121) & (uint)fVar149);
                        fVar43 = auVar64._0_4_ - fVar93 * 0.6931472;
                        fVar88 = auVar64._4_4_ - fVar113 * 0.6931472;
                        fVar90 = auVar64._8_4_ - fVar118 * 0.6931472;
                        fVar92 = auVar64._12_4_ - fVar121 * 0.6931472;
                        auVar153._0_4_ =
                             (float)((int)fVar93 * 0x800000 + (int)fVar123) *
                             (fVar43 + fVar123 +
                             (((((fVar43 * 0.00019875691 + 0.0013981999) * fVar43 + 0.008333452) *
                                fVar43 + 0.041665796) * fVar43 + 0.16666666) * fVar43 + 0.5) *
                             fVar43 * fVar43) + fVar123;
                        auVar153._4_4_ =
                             (float)((int)fVar113 * 0x800000 + (int)fVar147) *
                             (fVar88 + fVar147 +
                             (((((fVar88 * 0.00019875691 + 0.0013981999) * fVar88 + 0.008333452) *
                                fVar88 + 0.041665796) * fVar88 + 0.16666666) * fVar88 + 0.5) *
                             fVar88 * fVar88) + fVar147;
                        auVar153._8_4_ =
                             (float)((int)fVar118 * 0x800000 + (int)fVar148) *
                             (fVar90 + fVar148 +
                             (((((fVar90 * 0.00019875691 + 0.0013981999) * fVar90 + 0.008333452) *
                                fVar90 + 0.041665796) * fVar90 + 0.16666666) * fVar90 + 0.5) *
                             fVar90 * fVar90) + fVar148;
                        auVar153._12_4_ =
                             (float)((int)fVar121 * 0x800000 + (int)fVar149) *
                             (fVar92 + fVar149 +
                             (((((fVar92 * 0.00019875691 + 0.0013981999) * fVar92 + 0.008333452) *
                                fVar92 + 0.041665796) * fVar92 + 0.16666666) * fVar92 + 0.5) *
                             fVar92 * fVar92) + fVar149;
                        auVar64 = maxps(auVar153,_DAT_005a4e90);
                        fVar43 = (float)(auVar64._0_4_ & 0x807fffff | 0x3f000000);
                        fVar90 = (float)(auVar64._4_4_ & 0x807fffff | 0x3f000000);
                        fVar93 = (float)(auVar64._8_4_ & 0x807fffff | 0x3f000000);
                        fVar118 = (float)(auVar64._12_4_ & 0x807fffff | 0x3f000000);
                        fVar88 = fVar43 + -1.0 +
                                 (float)(-(uint)(fVar43 < 0.70710677) & (uint)fVar43);
                        fVar92 = fVar90 + -1.0 +
                                 (float)(-(uint)(fVar90 < 0.70710677) & (uint)fVar90);
                        fVar113 = fVar93 + -1.0 +
                                  (float)(-(uint)(fVar93 < 0.70710677) & (uint)fVar93);
                        fVar121 = fVar118 + -1.0 +
                                  (float)(-(uint)(fVar118 < 0.70710677) & (uint)fVar118);
                        auVar136._0_8_ =
                             CONCAT44(-(uint)(auVar153._4_4_ <= 0.0),-(uint)(auVar153._0_4_ <= 0.0))
                             & 0x7fffffff7fffffff;
                        auVar136._8_4_ = -(uint)(auVar153._8_4_ <= 0.0) & 0x7fffffff;
                        auVar136._12_4_ = -(uint)(auVar153._12_4_ <= 0.0) & 0x7fffffff;
                        auVar81._0_4_ =
                             ~-(uint)(auVar153._0_4_ <= 0.0) &
                             (uint)((((float)(int)((auVar64._0_4_ >> 0x17) - 0x7e) -
                                     (float)(-(uint)(fVar43 < 0.70710677) & (uint)fVar123)) *
                                     0.6931472 + fVar88 +
                                    (((((((((fVar88 * 0.070376836 + -0.1151461) * fVar88 +
                                           0.116769984) * fVar88 + -0.12420141) * fVar88 +
                                         0.14249323) * fVar88 + -0.16668057) * fVar88 + 0.20000714)
                                       * fVar88 + -0.24999994) * fVar88 + 0.3333333) * fVar88 + -0.5
                                    ) * fVar88 * fVar88) * -2.0);
                        auVar81._4_4_ =
                             ~-(uint)(auVar153._4_4_ <= 0.0) &
                             (uint)((((float)(int)((auVar64._4_4_ >> 0x17) - 0x7e) -
                                     (float)(-(uint)(fVar90 < 0.70710677) & (uint)fVar147)) *
                                     0.6931472 + fVar92 +
                                    (((((((((fVar92 * 0.070376836 + -0.1151461) * fVar92 +
                                           0.116769984) * fVar92 + -0.12420141) * fVar92 +
                                         0.14249323) * fVar92 + -0.16668057) * fVar92 + 0.20000714)
                                       * fVar92 + -0.24999994) * fVar92 + 0.3333333) * fVar92 + -0.5
                                    ) * fVar92 * fVar92) * -2.0);
                        auVar81._8_4_ =
                             ~-(uint)(auVar153._8_4_ <= 0.0) &
                             (uint)((((float)(int)((auVar64._8_4_ >> 0x17) - 0x7e) -
                                     (float)(-(uint)(fVar93 < 0.70710677) & (uint)fVar148)) *
                                     0.6931472 + fVar113 +
                                    (((((((((fVar113 * 0.070376836 + -0.1151461) * fVar113 +
                                           0.116769984) * fVar113 + -0.12420141) * fVar113 +
                                         0.14249323) * fVar113 + -0.16668057) * fVar113 + 0.20000714
                                       ) * fVar113 + -0.24999994) * fVar113 + 0.3333333) * fVar113 +
                                    -0.5) * fVar113 * fVar113) * -2.0);
                        auVar81._12_4_ =
                             ~-(uint)(auVar153._12_4_ <= 0.0) &
                             (uint)((((float)(int)((auVar64._12_4_ >> 0x17) - 0x7e) -
                                     (float)(-(uint)(fVar118 < 0.70710677) & (uint)fVar149)) *
                                     0.6931472 + fVar121 +
                                    (((((((((fVar121 * 0.070376836 + -0.1151461) * fVar121 +
                                           0.116769984) * fVar121 + -0.12420141) * fVar121 +
                                         0.14249323) * fVar121 + -0.16668057) * fVar121 + 0.20000714
                                       ) * fVar121 + -0.24999994) * fVar121 + 0.3333333) * fVar121 +
                                    -0.5) * fVar121 * fVar121) * -2.0);
                        auVar64 = minps(auVar81 | auVar136,_DAT_005a4de0);
                        auVar64 = maxps(auVar64,_DAT_005a4df0);
                        fVar43 = auVar64._0_4_ * fVar124 + 0.5;
                        fVar88 = auVar64._4_4_ * fVar138 + 0.5;
                        fVar90 = auVar64._8_4_ * fVar139 + 0.5;
                        fVar92 = auVar64._12_4_ * fVar140 + 0.5;
                        fVar124 = (float)(int)fVar43;
                        fVar138 = (float)(int)fVar88;
                        fVar139 = (float)(int)fVar90;
                        fVar140 = (float)(int)fVar92;
                        fVar124 = fVar124 - (float)(-(uint)(fVar43 < fVar124) & (uint)fVar123);
                        fVar138 = fVar138 - (float)(-(uint)(fVar88 < fVar138) & (uint)fVar147);
                        fVar139 = fVar139 - (float)(-(uint)(fVar90 < fVar139) & (uint)fVar148);
                        fVar140 = fVar140 - (float)(-(uint)(fVar92 < fVar140) & (uint)fVar149);
                        fVar43 = auVar64._0_4_ - fVar124 * 0.6931472;
                        fVar88 = auVar64._4_4_ - fVar138 * 0.6931472;
                        fVar90 = auVar64._8_4_ - fVar139 * 0.6931472;
                        fVar92 = auVar64._12_4_ - fVar140 * 0.6931472;
                        auVar106._0_4_ =
                             (float)((int)fVar124 * 0x800000 + (int)fVar123) *
                             (fVar43 + fVar123 +
                             (((((fVar43 * 0.00019875691 + 0.0013981999) * fVar43 + 0.008333452) *
                                fVar43 + 0.041665796) * fVar43 + 0.16666666) * fVar43 + 0.5) *
                             fVar43 * fVar43) + fVar123;
                        auVar106._4_4_ =
                             (float)((int)fVar138 * 0x800000 + (int)fVar147) *
                             (fVar88 + fVar147 +
                             (((((fVar88 * 0.00019875691 + 0.0013981999) * fVar88 + 0.008333452) *
                                fVar88 + 0.041665796) * fVar88 + 0.16666666) * fVar88 + 0.5) *
                             fVar88 * fVar88) + fVar147;
                        auVar106._8_4_ =
                             (float)((int)fVar139 * 0x800000 + (int)fVar148) *
                             (fVar90 + fVar148 +
                             (((((fVar90 * 0.00019875691 + 0.0013981999) * fVar90 + 0.008333452) *
                                fVar90 + 0.041665796) * fVar90 + 0.16666666) * fVar90 + 0.5) *
                             fVar90 * fVar90) + fVar148;
                        auVar106._12_4_ =
                             (float)((int)fVar140 * 0x800000 + (int)fVar149) *
                             (fVar92 + fVar149 +
                             (((((fVar92 * 0.00019875691 + 0.0013981999) * fVar92 + 0.008333452) *
                                fVar92 + 0.041665796) * fVar92 + 0.16666666) * fVar92 + 0.5) *
                             fVar92 * fVar92) + fVar149;
                        auVar64 = divps(_DAT_005a5aa0,auVar106);
                        auVar85._0_4_ = auVar64._0_4_ + -1.0;
                        auVar85._4_4_ = auVar64._4_4_ + -1.0;
                        auVar85._8_4_ = auVar64._8_4_ + -1.0;
                        auVar85._12_4_ = auVar64._12_4_ + -1.0;
                        goto LAB_003dc32c;
                      case 6:
                        pfVar1 = (float *)(this->super_ConvolutionDepthWise).activation_params.data;
                        fVar123 = *pfVar1;
                        fVar147 = pfVar1[1];
                        auVar137._0_4_ = fVar123 * fVar43 + fVar147;
                        auVar137._4_4_ = fVar123 * fVar88 + fVar147;
                        auVar137._8_4_ = fVar123 * fVar90 + fVar147;
                        auVar137._12_4_ = fVar123 * fVar92 + fVar147;
                        auVar133 = maxps(auVar137,auVar64);
                        auVar133 = minps(auVar133,_DAT_005a4e20);
                        auVar62._0_4_ = fVar43 * auVar133._0_4_;
                        auVar62._4_4_ = fVar88 * auVar133._4_4_;
                        auVar62._8_4_ = fVar90 * auVar133._8_4_;
                        auVar62._12_4_ = fVar92 * auVar133._12_4_;
                        auVar84._0_4_ = fVar123 * auVar145._0_4_ + fVar147;
                        auVar84._4_4_ = fVar123 * fVar95 + fVar147;
                        auVar84._8_4_ = fVar123 * fVar115 + fVar147;
                        auVar84._12_4_ = fVar123 * fVar120 + fVar147;
                        auVar64 = maxps(auVar84,auVar64);
                        auVar85 = minps(auVar64,_DAT_005a4e20);
LAB_003dc32c:
                        auVar145._0_4_ = auVar145._0_4_ * auVar85._0_4_;
                        auVar145._4_4_ = fVar95 * auVar85._4_4_;
                        auVar145._8_4_ = fVar115 * auVar85._8_4_;
                        auVar145._12_4_ = fVar120 * auVar85._12_4_;
                      }
                      if (iVar44 < 0x65) {
                        *pauVar49 = auVar62;
                        pauVar49[1] = auVar145;
                        pauVar49 = pauVar49 + 2;
                      }
                      else {
                        pvVar13 = (this->super_ConvolutionDepthWise).top_blob_int8_scales.data;
                        pfVar1 = (float *)((long)pvVar13 + (long)local_2f0 * 0x20);
                        pfVar2 = (float *)((long)pvVar13 + (long)local_2f0 * 0x20 + 0x10);
                        fVar43 = *pfVar1 * auVar62._0_4_;
                        fVar88 = pfVar1[1] * auVar62._4_4_;
                        fVar90 = pfVar1[2] * auVar62._8_4_;
                        fVar92 = pfVar1[3] * auVar62._12_4_;
                        fVar95 = *pfVar2 * auVar145._0_4_;
                        fVar115 = pfVar2[1] * auVar145._4_4_;
                        fVar120 = pfVar2[2] * auVar145._8_4_;
                        fVar123 = pfVar2[3] * auVar145._12_4_;
                        auVar63._0_4_ =
                             (int)((float)((uint)fVar43 & 0x80000000 | 0x3f000000) + fVar43);
                        auVar63._4_4_ =
                             (int)((float)((uint)fVar88 & 0x80000000 | 0x3f000000) + fVar88);
                        auVar63._8_4_ =
                             (int)((float)((uint)fVar90 & 0x80000000 | 0x3f000000) + fVar90);
                        auVar63._12_4_ =
                             (int)((float)((uint)fVar92 & 0x80000000 | 0x3f000000) + fVar92);
                        auVar86._0_4_ =
                             (int)((float)((uint)fVar95 & 0x80000000 | 0x3f000000) + fVar95);
                        auVar86._4_4_ =
                             (int)((float)((uint)fVar115 & 0x80000000 | 0x3f000000) + fVar115);
                        auVar86._8_4_ =
                             (int)((float)((uint)fVar120 & 0x80000000 | 0x3f000000) + fVar120);
                        auVar86._12_4_ =
                             (int)((float)((uint)fVar123 & 0x80000000 | 0x3f000000) + fVar123);
                        auVar64 = packssdw(auVar63,auVar86);
                        sVar146 = auVar64._0_2_;
                        uVar59 = (ushort)(0x7f < sVar146) * 0x7f |
                                 (ushort)(0x7f >= sVar146) * sVar146;
                        sVar146 = auVar64._2_2_;
                        uVar66 = (ushort)(0x7f < sVar146) * 0x7f |
                                 (ushort)(0x7f >= sVar146) * sVar146;
                        sVar146 = auVar64._4_2_;
                        uVar67 = (ushort)(0x7f < sVar146) * 0x7f |
                                 (ushort)(0x7f >= sVar146) * sVar146;
                        sVar146 = auVar64._6_2_;
                        uVar68 = (ushort)(0x7f < sVar146) * 0x7f |
                                 (ushort)(0x7f >= sVar146) * sVar146;
                        sVar146 = auVar64._8_2_;
                        uVar69 = (ushort)(0x7f < sVar146) * 0x7f |
                                 (ushort)(0x7f >= sVar146) * sVar146;
                        sVar146 = auVar64._10_2_;
                        uVar70 = (ushort)(0x7f < sVar146) * 0x7f |
                                 (ushort)(0x7f >= sVar146) * sVar146;
                        sVar146 = auVar64._12_2_;
                        sVar74 = auVar64._14_2_;
                        uVar71 = (ushort)(0x7f < sVar146) * 0x7f |
                                 (ushort)(0x7f >= sVar146) * sVar146;
                        uVar73 = (ushort)(0x7f < sVar74) * 0x7f | (ushort)(0x7f >= sVar74) * sVar74;
                        auVar65._0_2_ =
                             (ushort)((short)uVar59 < -0x7f) * -0x7f |
                             ((short)uVar59 >= -0x7f) * uVar59;
                        auVar65._2_2_ =
                             (ushort)((short)uVar66 < -0x7f) * -0x7f |
                             ((short)uVar66 >= -0x7f) * uVar66;
                        auVar65._4_2_ =
                             (ushort)((short)uVar67 < -0x7f) * -0x7f |
                             ((short)uVar67 >= -0x7f) * uVar67;
                        auVar65._6_2_ =
                             (ushort)((short)uVar68 < -0x7f) * -0x7f |
                             ((short)uVar68 >= -0x7f) * uVar68;
                        auVar65._8_2_ =
                             (ushort)((short)uVar69 < -0x7f) * -0x7f |
                             ((short)uVar69 >= -0x7f) * uVar69;
                        auVar65._10_2_ =
                             (ushort)((short)uVar70 < -0x7f) * -0x7f |
                             ((short)uVar70 >= -0x7f) * uVar70;
                        auVar65._12_2_ =
                             (ushort)((short)uVar71 < -0x7f) * -0x7f |
                             ((short)uVar71 >= -0x7f) * uVar71;
                        auVar65._14_2_ =
                             (ushort)((short)uVar73 < -0x7f) * -0x7f |
                             ((short)uVar73 >= -0x7f) * uVar73;
                        auVar64 = packsswb(auVar65,auVar65);
                        *(long *)*pauVar47 = auVar64._0_8_;
                        pauVar47 = (undefined1 (*) [16])((long)*pauVar47 + 8);
                      }
                      bVar58 = iVar36 != iVar48;
                      iVar36 = iVar36 + 1;
                    } while (bVar58);
                  }
                  bVar58 = iVar40 != (int)local_230;
                  iVar40 = iVar40 + 1;
                } while (bVar58);
              }
              local_2f0 = (undefined4 *)((long)local_2f0 + 1);
              iVar56 = iVar56 + iVar51;
            } while (local_2f0 != local_288);
          }
          if ((pointer)local_2d8._0_8_ != (pointer)0x0) {
            uVar57 = local_2d8._16_8_ - local_2d8._0_8_;
            pfVar55 = (pointer)local_2d8._0_8_;
LAB_003dc40e:
            operator_delete(pfVar55,uVar57);
          }
LAB_003dd401:
          iVar40 = 0;
        }
      }
    }
    else {
      uVar39 = (this->super_ConvolutionDepthWise).num_output;
      iVar48 = (this->super_ConvolutionDepthWise).int8_scale_term;
      local_288 = (undefined4 *)0x1;
      if (opt->use_packing_layout == true) {
        if (iVar48 < 0x65) {
          local_288 = (undefined4 *)(ulong)((uint)((uVar39 & 3) == 0) * 3 + 1);
        }
        else {
          local_288 = (undefined4 *)0x1;
          if ((uVar39 & 7) == 0) {
            local_288 = (undefined4 *)&DAT_00000008;
          }
        }
      }
      local_280 = CONCAT44(local_280._4_4_,local_228.elempack);
      iVar44 = (int)local_288;
      puVar45 = (undefined4 *)(ulong)(uint)(iVar44 * 4);
      if (100 < iVar48) {
        puVar45 = local_288;
      }
      Mat::create(top_blob,iVar51,iVar56,(int)uVar39 / iVar44,(size_t)puVar45,iVar44,
                  opt->blob_allocator);
      auVar133 = local_2a8;
      auVar64 = stack0xfffffffffffffd38;
      iVar40 = -100;
      if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
        iVar44 = (this->super_ConvolutionDepthWise).group;
        uVar54 = (int)uVar54 / iVar44;
        uVar38 = (this->super_ConvolutionDepthWise).num_output / iVar44;
        iVar44 = 1;
        uVar39 = 1;
        if (opt->use_packing_layout == true) {
          iVar44 = 1;
          if ((uVar54 & 7) == 0) {
            iVar44 = 8;
          }
          if (iVar48 < 0x65) {
            uVar39 = (uint)((uVar38 & 3) == 0) * 3 + 1;
          }
          else {
            uVar39 = 1;
            if ((uVar38 & 7) == 0) {
              uVar39 = 8;
            }
          }
        }
        local_2d8._8_8_ = CONCAT44(local_228.refcount._4_4_,local_228.refcount._0_4_);
        local_2d8._0_8_ = local_228.data;
        local_2d8._20_4_ = local_228.elemsize._4_4_;
        local_2d8._16_4_ = (undefined4)local_228.elemsize;
        uStack_2c0._4_4_ = auVar64._12_4_;
        uStack_2c0._0_4_ = local_228.elempack;
        local_2b8 = local_228.allocator;
        iStack_2ac = local_228.w;
        iStack_2b0 = local_228.dims;
        local_2a8._4_4_ = local_228.d;
        local_2a8._0_4_ = local_228.h;
        local_2a8._12_4_ = auVar133._12_4_;
        local_2a8._8_4_ = local_228.c;
        local_298 = local_228.cstep;
        if ((int *)local_2d8._8_8_ != (int *)0x0) {
          LOCK();
          *(int *)local_2d8._8_8_ = *(int *)local_2d8._8_8_ + 1;
          UNLOCK();
        }
        if (iVar44 < (int)local_280) {
          local_278.data = *(void **)opt;
          local_278.elemsize = (size_t)opt->workspace_allocator;
          local_278.elempack = opt->openmp_blocktime;
          local_278._28_1_ = opt->use_winograd_convolution;
          local_278._29_1_ = opt->use_sgemm_convolution;
          local_278._30_1_ = opt->use_int8_inference;
          local_278._31_1_ = opt->use_vulkan_compute;
          local_278.allocator = *(Allocator **)&opt->use_bf16_storage;
          local_278._40_8_ = *(undefined8 *)&opt->vulkan_device_index;
          local_278._48_8_ = *(undefined8 *)&opt->flush_denormals;
          local_278._56_8_ = *(undefined8 *)&opt->use_winograd43_convolution;
          local_278.refcount = (int *)opt->workspace_allocator;
          convert_packing(&local_228,(Mat *)local_2d8,iVar44,(Option *)&local_278);
          if (((pointer)local_2d8._0_8_ != (pointer)0x0) &&
             ((long)(int)local_2a8._8_4_ * local_298 != 0)) goto LAB_003dc7f7;
          iVar40 = -100;
        }
        else {
LAB_003dc7f7:
          local_278.data = top_blob->data;
          local_278.refcount = top_blob->refcount;
          local_278.elemsize = top_blob->elemsize;
          local_278.elempack = top_blob->elempack;
          local_278.allocator = top_blob->allocator;
          local_278.dims = top_blob->dims;
          local_278.w = top_blob->w;
          local_278.h = top_blob->h;
          local_278.d = top_blob->d;
          local_278.c = top_blob->c;
          local_278.cstep = top_blob->cstep;
          if ((Allocator *)local_278.refcount != (Allocator *)0x0) {
            LOCK();
            *(int *)&((Allocator *)local_278.refcount)->_vptr_Allocator =
                 *(int *)&((Allocator *)local_278.refcount)->_vptr_Allocator + 1;
            UNLOCK();
          }
          if (uVar39 < (uint)local_288) {
            Mat::create(&local_278,iVar51,iVar56,
                        (this->super_ConvolutionDepthWise).num_output / (int)uVar39,
                        (ulong)((byte)((ushort)puVar45 / (ushort)(byte)local_288) * uVar39),uVar39,
                        opt->workspace_allocator);
            iVar40 = -100;
            if ((local_278.data != (void *)0x0) && ((long)local_278.c * local_278.cstep != 0))
            goto LAB_003dc8d4;
          }
          else {
LAB_003dc8d4:
            if (0 < (this->super_ConvolutionDepthWise).group) {
              iVar48 = 0;
              iVar56 = 0;
              lVar41 = 0;
              do {
                local_1d0 = (pointer)((long)(iVar48 / iVar44) * local_298 * local_2d8._16_8_ +
                                     local_2d8._0_8_);
                local_1c8 = (int *)0x0;
                local_1c0 = (Allocator *)local_2d8._16_8_;
                local_1b8 = (int)uStack_2c0;
                local_1b0 = local_2b8;
                local_1a4 = iStack_2ac;
                local_1a0 = local_2a8._0_4_;
                local_19c = local_2a8._4_4_;
                local_190 = ((long)(int)local_2a8._4_4_ * local_2d8._16_8_ *
                             (long)(int)local_2a8._0_4_ * (long)iStack_2ac + 0xfU &
                            0xfffffffffffffff0) / (ulong)local_2d8._16_8_;
                local_1a8 = iStack_2b0;
                local_130 = (void *)((long)(iVar56 / (int)uVar39) * local_278.cstep *
                                     local_278.elemsize + (long)local_278.data);
                local_128 = (int *)0x0;
                local_120 = (Allocator *)local_278.elemsize;
                local_118 = local_278.elempack;
                local_110 = local_278.allocator;
                local_104 = local_278.w;
                local_100 = local_278.h;
                local_fc = local_278.d;
                local_f0 = ((long)local_278.d * local_278.elemsize *
                            (long)local_278.h * (long)local_278.w + 0xf & 0xfffffffffffffff0) /
                           local_278.elemsize;
                local_108 = local_278.dims;
                pLVar16 = (this->group_ops).
                          super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar41];
                local_78._0_1_ = opt->lightmode;
                local_78._1_1_ = opt->use_shader_pack8;
                local_78._2_1_ = opt->use_subgroup_ops;
                local_78._3_1_ = opt->use_reserved_0;
                local_78._4_4_ = opt->num_threads;
                local_68 = opt->workspace_allocator;
                uStack_60._0_4_ = opt->openmp_blocktime;
                uStack_60._4_1_ = opt->use_winograd_convolution;
                uStack_60._5_1_ = opt->use_sgemm_convolution;
                uStack_60._6_1_ = opt->use_int8_inference;
                uStack_60._7_1_ = opt->use_vulkan_compute;
                local_58._0_1_ = opt->use_bf16_storage;
                local_58._1_1_ = opt->use_fp16_packed;
                local_58._2_1_ = opt->use_fp16_storage;
                local_58._3_1_ = opt->use_fp16_arithmetic;
                uStack_54._0_1_ = opt->use_int8_packed;
                uStack_54._1_1_ = opt->use_int8_storage;
                uStack_54._2_1_ = opt->use_int8_arithmetic;
                uStack_54._3_1_ = opt->use_packing_layout;
                iStack_50 = opt->vulkan_device_index;
                uStack_4c._0_1_ = opt->use_reserved_1;
                uStack_4c._1_1_ = opt->use_image_storage;
                uStack_4c._2_1_ = opt->use_tensor_storage;
                uStack_4c._3_1_ = opt->use_reserved_2;
                local_48._0_4_ = opt->flush_denormals;
                local_48._4_1_ = opt->use_local_pool_allocator;
                local_48._5_1_ = opt->use_shader_local_memory;
                local_48._6_1_ = opt->use_cooperative_matrix;
                local_48._7_1_ = opt->use_winograd23_convolution;
                uStack_40._0_1_ = opt->use_winograd43_convolution;
                uStack_40._1_1_ = opt->use_winograd63_convolution;
                uStack_40._2_1_ = opt->use_a53_a55_optimized_kernel;
                uStack_40._3_1_ = opt->use_fp16_uniform;
                uStack_40._4_1_ = opt->use_int8_uniform;
                uStack_40._5_1_ = opt->use_reserved_9;
                uStack_40._6_1_ = opt->use_reserved_10;
                uStack_40._7_1_ = opt->use_reserved_11;
                pAStack_70 = local_278.allocator;
                local_198 = (int)uVar54 / iVar44;
                local_f8 = (int)uVar38 / (int)uVar39;
                iVar40 = (*pLVar16->_vptr_Layer[7])(pLVar16,&local_1d0,&local_130,&local_78);
                if (local_128 != (int *)0x0) {
                  LOCK();
                  *local_128 = *local_128 + -1;
                  UNLOCK();
                  if (*local_128 == 0) {
                    if (local_110 == (Allocator *)0x0) {
                      if (local_130 != (void *)0x0) {
                        free(local_130);
                      }
                    }
                    else {
                      (*local_110->_vptr_Allocator[3])();
                    }
                  }
                }
                if (local_1c8 != (int *)0x0) {
                  LOCK();
                  *local_1c8 = *local_1c8 + -1;
                  UNLOCK();
                  if (*local_1c8 == 0) {
                    if (local_1b0 == (Allocator *)0x0) {
                      if (local_1d0 != (pointer)0x0) {
                        free(local_1d0);
                      }
                    }
                    else {
                      (*local_1b0->_vptr_Allocator[3])();
                    }
                  }
                }
                if (iVar40 != 0) goto LAB_003dd468;
                lVar41 = lVar41 + 1;
                iVar56 = iVar56 + uVar38;
                iVar48 = iVar48 + uVar54;
              } while (lVar41 < (this->super_ConvolutionDepthWise).group);
            }
            if (uVar39 < (uint)local_288) {
              convert_packing(&local_278,top_blob,(uint)local_288,opt);
              iVar40 = -100;
              if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0))
              goto LAB_003dd468;
            }
            else if (&local_278 != top_blob) {
              if ((Allocator *)local_278.refcount != (Allocator *)0x0) {
                LOCK();
                *(int *)(_func_int ***)local_278.refcount =
                     *(int *)(_func_int ***)local_278.refcount + 1;
                UNLOCK();
              }
              piVar15 = top_blob->refcount;
              if (piVar15 != (int *)0x0) {
                LOCK();
                *piVar15 = *piVar15 + -1;
                UNLOCK();
                if (*piVar15 == 0) {
                  if (top_blob->allocator == (Allocator *)0x0) {
                    if (top_blob->data != (void *)0x0) {
                      free(top_blob->data);
                    }
                  }
                  else {
                    (*top_blob->allocator->_vptr_Allocator[3])();
                  }
                }
              }
              top_blob->data = local_278.data;
              top_blob->refcount = local_278.refcount;
              top_blob->elemsize = local_278.elemsize;
              top_blob->elempack = local_278.elempack;
              top_blob->allocator = local_278.allocator;
              top_blob->dims = local_278.dims;
              top_blob->w = local_278.w;
              top_blob->h = local_278.h;
              top_blob->d = local_278.d;
              top_blob->c = local_278.c;
              top_blob->cstep = local_278.cstep;
            }
            iVar40 = 0;
          }
LAB_003dd468:
          if ((Allocator *)local_278.refcount != (Allocator *)0x0) {
            LOCK();
            *(int *)(_func_int ***)local_278.refcount =
                 *(int *)(_func_int ***)local_278.refcount + -1;
            UNLOCK();
            if (*(int *)(_func_int ***)local_278.refcount == 0) {
              if (local_278.allocator == (Allocator *)0x0) {
                if (local_278.data != (void *)0x0) {
                  free(local_278.data);
                }
              }
              else {
                (*(local_278.allocator)->_vptr_Allocator[3])();
              }
            }
          }
        }
        if ((Allocator *)local_2d8._8_8_ != (Allocator *)0x0) {
          LOCK();
          *(int *)(_func_int ***)local_2d8._8_8_ = *(int *)(_func_int ***)local_2d8._8_8_ + -1;
          UNLOCK();
          if (*(int *)(_func_int ***)local_2d8._8_8_ == 0) {
            if (local_2b8 == (Allocator *)0x0) {
              if ((pointer)local_2d8._0_8_ != (pointer)0x0) {
                free((void *)local_2d8._0_8_);
              }
            }
            else {
              (*local_2b8->_vptr_Allocator[3])();
            }
          }
        }
      }
    }
  }
  piVar15 = (int *)CONCAT44(local_228.refcount._4_4_,local_228.refcount._0_4_);
  if (piVar15 != (int *)0x0) {
    LOCK();
    *piVar15 = *piVar15 + -1;
    UNLOCK();
    if (*piVar15 == 0) {
      if (local_228.allocator == (Allocator *)0x0) {
        if ((undefined4 *)local_228.data != (undefined4 *)0x0) {
          free(local_228.data);
        }
      }
      else {
        (*(local_228.allocator)->_vptr_Allocator[3])();
      }
    }
  }
LAB_003dd52b:
  if (local_188.refcount != (int *)0x0) {
    LOCK();
    *local_188.refcount = *local_188.refcount + -1;
    UNLOCK();
    if (*local_188.refcount == 0) {
      if (local_188.allocator == (Allocator *)0x0) {
        if (local_188.data != (void *)0x0) {
          free(local_188.data);
        }
      }
      else {
        (*(local_188.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar40;
}

Assistant:

int ConvolutionDepthWise_x86::forward_int8_x86(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    int elempack = bottom_blob.elempack;

    int elembits = bottom_blob.elembits();

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_int8 = bottom_blob;
    if (elembits != 8)
    {
        const int channels_g = channels * elempack / group;

        Mat scales(channels * elempack);
        {
            float* ps = scales;
            for (int g = 0; g < group; g++)
            {
                float scale = bottom_blob_int8_scales[g];
                for (int q = 0; q < channels_g; q++)
                {
                    *ps++ = scale;
                }
            }
        }

        Option opt_q = opt;
        opt_q.blob_allocator = opt.workspace_allocator;
        quantize_to_int8(bottom_blob, bottom_blob_int8, scales, opt_q);
        if (bottom_blob_int8.empty())
            return -100;
    }

    Mat bottom_blob_bordered;
    make_padding(bottom_blob_int8, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;
    channels = bottom_blob_bordered.c;
    elempack = bottom_blob_bordered.elempack;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;

    // depth-wise
    if (channels * elempack == group && group == num_output)
    {
        int out_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
            out_elempack = num_output % 8 == 0 ? 8 : 1;
        }
#endif // __SSE2__
        bool use_int8_requantize = int8_scale_term > 100;
        size_t out_elemsize = use_int8_requantize ? 1u * out_elempack : 4u * out_elempack;

        top_blob.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

#if __SSE2__
        if (elempack == 8)
        {
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    signed char* outptr_s8 = top_blob.channel(g);
                    float* outptr_f32 = top_blob.channel(g);
                    const signed char* kptr = (const signed char*)weight_data_tm + maxk * g * 8;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m128i _sum0 = _mm_setzero_si128();
                            __m128i _sum1 = _mm_setzero_si128();

                            const signed char* sptr = m.row<const signed char>(i * stride_h) + j * stride_w * 8;

                            for (int k = 0; k < maxk; k++)
                            {
                                // TODO use _mm_cvtepi8_epi16 on sse4.1
                                __m128i _val = _mm_loadl_epi64((const __m128i*)(sptr + space_ofs[k] * 8));
                                _val = _mm_unpacklo_epi8(_val, _mm_cmpgt_epi8(_mm_setzero_si128(), _val));

                                __m128i _w = _mm_loadl_epi64((const __m128i*)(kptr + k * 8));
                                _w = _mm_unpacklo_epi8(_w, _mm_cmpgt_epi8(_mm_setzero_si128(), _w));

                                __m128i _sl = _mm_mullo_epi16(_val, _w);
                                __m128i _sh = _mm_mulhi_epi16(_val, _w);
                                __m128i _s0 = _mm_unpacklo_epi16(_sl, _sh);
                                __m128i _s1 = _mm_unpackhi_epi16(_sl, _sh);

                                _sum0 = _mm_add_epi32(_sum0, _s0);
                                _sum1 = _mm_add_epi32(_sum1, _s1);
                            }

                            __m128 _scale_in0;
                            __m128 _scale_in1;
                            {
                                __m128 _bottom_blob_int8_scales0 = _mm_loadu_ps((const float*)bottom_blob_int8_scales + g * 8);
                                __m128 _bottom_blob_int8_scales1 = _mm_loadu_ps((const float*)bottom_blob_int8_scales + g * 8 + 4);
                                __m128 _weight_data_int8_scales0 = _mm_loadu_ps((const float*)weight_data_int8_scales + g * 8);
                                __m128 _weight_data_int8_scales1 = _mm_loadu_ps((const float*)weight_data_int8_scales + g * 8 + 4);
                                _scale_in0 = _mm_rcp_ps(_mm_mul_ps(_bottom_blob_int8_scales0, _weight_data_int8_scales0));
                                _scale_in1 = _mm_rcp_ps(_mm_mul_ps(_bottom_blob_int8_scales1, _weight_data_int8_scales1));

                                __m128 _m0 = _mm_cmpneq_ps(_weight_data_int8_scales0, _mm_setzero_ps());
                                __m128 _m1 = _mm_cmpneq_ps(_weight_data_int8_scales1, _mm_setzero_ps());
                                _scale_in0 = _mm_and_ps(_scale_in0, _m0);
                                _scale_in1 = _mm_and_ps(_scale_in1, _m1);
                            }

                            __m128 _sumfp32_0 = _mm_mul_ps(_mm_cvtepi32_ps(_sum0), _scale_in0);
                            __m128 _sumfp32_1 = _mm_mul_ps(_mm_cvtepi32_ps(_sum1), _scale_in1);

                            if (bias_term)
                            {
                                __m128 _bias0 = _mm_loadu_ps((const float*)bias_data + g * 8);
                                __m128 _bias1 = _mm_loadu_ps((const float*)bias_data + g * 8 + 4);
                                _sumfp32_0 = _mm_add_ps(_sumfp32_0, _bias0);
                                _sumfp32_1 = _mm_add_ps(_sumfp32_1, _bias1);
                            }

                            _sumfp32_0 = activation_sse(_sumfp32_0, activation_type, activation_params);
                            _sumfp32_1 = activation_sse(_sumfp32_1, activation_type, activation_params);

                            if (use_int8_requantize)
                            {
                                // requantize and relu
                                __m128 _scale_out0 = _mm_loadu_ps((const float*)top_blob_int8_scales + g * 8);
                                __m128 _scale_out1 = _mm_loadu_ps((const float*)top_blob_int8_scales + g * 8 + 4);
                                _sumfp32_0 = _mm_mul_ps(_sumfp32_0, _scale_out0);
                                _sumfp32_1 = _mm_mul_ps(_sumfp32_1, _scale_out1);
                                int64_t _sum8 = float2int8_sse(_sumfp32_0, _sumfp32_1);

                                *(int64_t*)outptr_s8 = _sum8;
                                outptr_s8 += 8;
                            }
                            else
                            {
                                // dequantize and relu
                                _mm_storeu_ps(outptr_f32, _sumfp32_0);
                                _mm_storeu_ps(outptr_f32 + 4, _sumfp32_1);
                                outptr_f32 += 8;
                            }
                        }
                    }
                }
            }
        }
#endif // __SSE2__

        if (elempack == 1)
        {
            if (kernel_w == 3 && kernel_h == 3 && stride_w == 1 && stride_h == 1 && dilation_w == 1 && dilation_h == 1 && (activation_type == 0 || activation_type == 1))
            {
                if (use_int8_requantize)
                {
                    std::vector<float> requantize_scales;
                    for (int g = 0; g < group; g++)
                    {
                        float scale_in;
                        if (weight_data_int8_scales[g] == 0)
                            scale_in = 0;
                        else
                            scale_in = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        float scale_out = top_blob_int8_scales[g];

                        requantize_scales.push_back(scale_in);
                        requantize_scales.push_back(scale_out);
                    }

                    convdw3x3s1_int8_requant_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, requantize_scales, opt);
                }
                else
                {
                    std::vector<float> dequantize_scales;
                    for (int g = 0; g < group; g++)
                    {
                        float top_rescale = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        dequantize_scales.push_back(top_rescale);
                    }

                    convdw3x3s1_int8_dequant_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, dequantize_scales, opt);
                }

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }
            }
            else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2 && (activation_type == 0 || activation_type == 1))
            {
                if (use_int8_requantize)
                {
                    std::vector<float> requantize_scales;
                    for (int g = 0; g < group; g++)
                    {
                        float scale_in;
                        if (weight_data_int8_scales[g] == 0)
                            scale_in = 0;
                        else
                            scale_in = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        float scale_out = top_blob_int8_scales[g];

                        requantize_scales.push_back(scale_in);
                        requantize_scales.push_back(scale_out);
                    }

                    convdw3x3s2_int8_requant_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, requantize_scales, opt);
                }
                else
                {
                    std::vector<float> dequantize_scales;
                    for (int g = 0; g < group; g++)
                    {
                        float top_rescale = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        dequantize_scales.push_back(top_rescale);
                    }

                    convdw3x3s2_int8_dequant_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, dequantize_scales, opt);
                }

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }
            }
            else
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < group; g++)
                {
                    signed char* outptr_s8 = top_blob.channel(g);
                    float* outptr_f32 = top_blob.channel(g);
                    const signed char* kptr = (const signed char*)weight_data_tm + maxk * g;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            int sum = 0;

                            const signed char* sptr = m.row<const signed char>(i * stride_h) + j * stride_w;

                            for (int k = 0; k < maxk; k++)
                            {
                                signed char val = sptr[space_ofs[k]];
                                signed char w = kptr[k];
                                sum += val * w;
                            }

                            float scale_in;
                            if (weight_data_int8_scales[g] == 0)
                                scale_in = 0;
                            else
                                scale_in = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                            float sumfp32 = sum * scale_in;

                            if (bias_term)
                                sumfp32 += bias_data[g];

                            sumfp32 = activation_ss(sumfp32, activation_type, activation_params);

                            if (use_int8_requantize)
                            {
                                // requantize
                                float scale_out = top_blob_int8_scales[g];
                                signed char sums8 = float2int8(sumfp32 * scale_out);
                                outptr_s8[0] = sums8;
                                outptr_s8 += 1;
                            }
                            else
                            {
                                // dequantize
                                outptr_f32[0] = sumfp32;
                                outptr_f32 += 1;
                            }
                        }
                    }
                }
            }
        }

        return 0;
    }

    bool use_int8_requantize = int8_scale_term > 100;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        if (use_int8_requantize)
            out_elempack = num_output % 8 == 0 ? 8 : 1;
        else
            out_elempack = num_output % 4 == 0 ? 4 : 1;
    }
#endif // __SSE2__
    size_t out_elemsize = use_int8_requantize ? 1u * out_elempack : 4u * out_elempack;

    top_blob.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // group convolution
    const int channels_g = channels * elempack / group;
    const int num_output_g = num_output / group;

    int g_elempack = 1;
    int out_g_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        g_elempack = channels_g % 8 == 0 ? 8 : 1;
        if (use_int8_requantize)
            out_g_elempack = num_output_g % 8 == 0 ? 8 : 1;
        else
            out_g_elempack = num_output_g % 4 == 0 ? 4 : 1;
    }
#endif // __SSE2__

    // unpacking
    Mat bottom_blob_bordered_unpacked = bottom_blob_bordered;
    if (elempack > g_elempack)
    {
        Option opt_p = opt;
        opt_p.blob_allocator = opt.workspace_allocator;
        convert_packing(bottom_blob_bordered, bottom_blob_bordered_unpacked, g_elempack, opt_p);
        if (bottom_blob_bordered_unpacked.empty())
            return -100;
    }

    Mat top_blob_unpacked = top_blob;
    if (out_g_elempack < out_elempack)
    {
        top_blob_unpacked.create(outw, outh, num_output / out_g_elempack, out_elemsize / out_elempack * out_g_elempack, out_g_elempack, opt.workspace_allocator);
        if (top_blob_unpacked.empty())
            return -100;
    }

    for (int g = 0; g < group; g++)
    {
        const Mat bottom_blob_bordered_g = bottom_blob_bordered_unpacked.channel_range(channels_g * g / g_elempack, channels_g / g_elempack);
        Mat top_blob_g = top_blob_unpacked.channel_range(num_output_g * g / out_g_elempack, num_output_g / out_g_elempack);

        const ncnn::Layer* op = group_ops[g];

        Option opt_g = opt;
        opt_g.blob_allocator = top_blob_unpacked.allocator;

        // forward
        int ret = op->forward(bottom_blob_bordered_g, top_blob_g, opt_g);
        if (ret != 0)
            return ret;
    }

    // packing
    if (out_g_elempack < out_elempack)
    {
        convert_packing(top_blob_unpacked, top_blob, out_elempack, opt);
        if (top_blob.empty())
            return -100;
    }
    else
    {
        top_blob = top_blob_unpacked;
    }

    return 0;
}